

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<8,16>::
     occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [32];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  byte bVar54;
  byte bVar55;
  byte bVar56;
  byte bVar57;
  uint uVar58;
  ulong uVar59;
  uint uVar60;
  long lVar61;
  byte bVar62;
  uint uVar63;
  uint uVar64;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar65;
  byte bVar66;
  bool bVar67;
  long lVar68;
  undefined1 uVar69;
  bool bVar70;
  undefined1 uVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  uint uVar147;
  uint uVar148;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  uint uVar149;
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  float pp;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar158 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar163 [64];
  undefined1 auVar162 [32];
  undefined1 extraout_var [60];
  undefined1 auVar164 [64];
  float fVar165;
  undefined4 uVar166;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar174 [32];
  undefined1 auVar167 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar184;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar211;
  float fVar212;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [28];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar257;
  undefined1 auVar256 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [32];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 extraout_var_00 [60];
  
  PVar2 = prim[1];
  uVar59 = (ulong)(byte)PVar2;
  lVar61 = uVar59 * 0x25;
  fVar212 = *(float *)(prim + lVar61 + 0x12);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar81 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar84 = vsubps_avx(auVar74,*(undefined1 (*) [16])(prim + lVar61 + 6));
  fVar211 = fVar212 * auVar84._0_4_;
  fVar150 = fVar212 * auVar81._0_4_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar59 * 4 + 6);
  auVar92 = vpmovsxbd_avx2(auVar74);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar59 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar16);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar59 * 6 + 6);
  auVar18 = vpmovsxbd_avx2(auVar76);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar59 * 0xf + 6);
  auVar93 = vpmovsxbd_avx2(auVar77);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar99 = vpmovsxbd_avx2(auVar78);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar94 = vcvtdq2ps_avx(auVar99);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar59 + 6);
  auVar95 = vpmovsxbd_avx2(auVar83);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar59 * 0x1a + 6);
  auVar96 = vpmovsxbd_avx2(auVar79);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar59 * 0x1b + 6);
  auVar97 = vpmovsxbd_avx2(auVar75);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar59 * 0x1c + 6);
  auVar90 = vpmovsxbd_avx2(auVar80);
  auVar98 = vcvtdq2ps_avx(auVar90);
  auVar106._4_4_ = fVar150;
  auVar106._0_4_ = fVar150;
  auVar106._8_4_ = fVar150;
  auVar106._12_4_ = fVar150;
  auVar106._16_4_ = fVar150;
  auVar106._20_4_ = fVar150;
  auVar106._24_4_ = fVar150;
  auVar106._28_4_ = fVar150;
  auVar112._8_4_ = 1;
  auVar112._0_8_ = 0x100000001;
  auVar112._12_4_ = 1;
  auVar112._16_4_ = 1;
  auVar112._20_4_ = 1;
  auVar112._24_4_ = 1;
  auVar112._28_4_ = 1;
  auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar101 = ZEXT1632(CONCAT412(fVar212 * auVar81._12_4_,
                                CONCAT48(fVar212 * auVar81._8_4_,
                                         CONCAT44(fVar212 * auVar81._4_4_,fVar150))));
  auVar100 = vpermps_avx2(auVar112,auVar101);
  auVar89 = vpermps_avx512vl(auVar88,auVar101);
  fVar165 = auVar89._0_4_;
  fVar178 = auVar89._4_4_;
  auVar101._4_4_ = fVar178 * auVar18._4_4_;
  auVar101._0_4_ = fVar165 * auVar18._0_4_;
  fVar179 = auVar89._8_4_;
  auVar101._8_4_ = fVar179 * auVar18._8_4_;
  fVar180 = auVar89._12_4_;
  auVar101._12_4_ = fVar180 * auVar18._12_4_;
  fVar182 = auVar89._16_4_;
  auVar101._16_4_ = fVar182 * auVar18._16_4_;
  fVar181 = auVar89._20_4_;
  auVar101._20_4_ = fVar181 * auVar18._20_4_;
  fVar183 = auVar89._24_4_;
  auVar101._24_4_ = fVar183 * auVar18._24_4_;
  auVar101._28_4_ = auVar99._28_4_;
  auVar99._4_4_ = auVar95._4_4_ * fVar178;
  auVar99._0_4_ = auVar95._0_4_ * fVar165;
  auVar99._8_4_ = auVar95._8_4_ * fVar179;
  auVar99._12_4_ = auVar95._12_4_ * fVar180;
  auVar99._16_4_ = auVar95._16_4_ * fVar182;
  auVar99._20_4_ = auVar95._20_4_ * fVar181;
  auVar99._24_4_ = auVar95._24_4_ * fVar183;
  auVar99._28_4_ = auVar90._28_4_;
  auVar90._4_4_ = auVar98._4_4_ * fVar178;
  auVar90._0_4_ = auVar98._0_4_ * fVar165;
  auVar90._8_4_ = auVar98._8_4_ * fVar179;
  auVar90._12_4_ = auVar98._12_4_ * fVar180;
  auVar90._16_4_ = auVar98._16_4_ * fVar182;
  auVar90._20_4_ = auVar98._20_4_ * fVar181;
  auVar90._24_4_ = auVar98._24_4_ * fVar183;
  auVar90._28_4_ = auVar89._28_4_;
  auVar74 = vfmadd231ps_fma(auVar101,auVar100,auVar91);
  auVar16 = vfmadd231ps_fma(auVar99,auVar100,auVar94);
  auVar76 = vfmadd231ps_fma(auVar90,auVar97,auVar100);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar106,auVar92);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar106,auVar93);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar96,auVar106);
  auVar111._4_4_ = fVar211;
  auVar111._0_4_ = fVar211;
  auVar111._8_4_ = fVar211;
  auVar111._12_4_ = fVar211;
  auVar111._16_4_ = fVar211;
  auVar111._20_4_ = fVar211;
  auVar111._24_4_ = fVar211;
  auVar111._28_4_ = fVar211;
  auVar90 = ZEXT1632(CONCAT412(fVar212 * auVar84._12_4_,
                               CONCAT48(fVar212 * auVar84._8_4_,
                                        CONCAT44(fVar212 * auVar84._4_4_,fVar211))));
  auVar99 = vpermps_avx2(auVar112,auVar90);
  auVar256 = ZEXT3264(auVar99);
  auVar90 = vpermps_avx512vl(auVar88,auVar90);
  fVar212 = auVar90._0_4_;
  fVar165 = auVar90._4_4_;
  auVar100._4_4_ = fVar165 * auVar18._4_4_;
  auVar100._0_4_ = fVar212 * auVar18._0_4_;
  fVar178 = auVar90._8_4_;
  auVar100._8_4_ = fVar178 * auVar18._8_4_;
  fVar179 = auVar90._12_4_;
  auVar100._12_4_ = fVar179 * auVar18._12_4_;
  fVar180 = auVar90._16_4_;
  auVar100._16_4_ = fVar180 * auVar18._16_4_;
  fVar182 = auVar90._20_4_;
  auVar100._20_4_ = fVar182 * auVar18._20_4_;
  fVar181 = auVar90._24_4_;
  auVar100._24_4_ = fVar181 * auVar18._24_4_;
  auVar100._28_4_ = fVar150;
  auVar88._4_4_ = auVar95._4_4_ * fVar165;
  auVar88._0_4_ = auVar95._0_4_ * fVar212;
  auVar88._8_4_ = auVar95._8_4_ * fVar178;
  auVar88._12_4_ = auVar95._12_4_ * fVar179;
  auVar88._16_4_ = auVar95._16_4_ * fVar180;
  auVar88._20_4_ = auVar95._20_4_ * fVar182;
  auVar88._24_4_ = auVar95._24_4_ * fVar181;
  auVar88._28_4_ = auVar18._28_4_;
  auVar95._4_4_ = auVar98._4_4_ * fVar165;
  auVar95._0_4_ = auVar98._0_4_ * fVar212;
  auVar95._8_4_ = auVar98._8_4_ * fVar178;
  auVar95._12_4_ = auVar98._12_4_ * fVar179;
  auVar95._16_4_ = auVar98._16_4_ * fVar180;
  auVar95._20_4_ = auVar98._20_4_ * fVar182;
  auVar95._24_4_ = auVar98._24_4_ * fVar181;
  auVar95._28_4_ = auVar90._28_4_;
  auVar77 = vfmadd231ps_fma(auVar100,auVar99,auVar91);
  auVar78 = vfmadd231ps_fma(auVar88,auVar99,auVar94);
  auVar83 = vfmadd231ps_fma(auVar95,auVar99,auVar97);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar111,auVar92);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar111,auVar93);
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar111,auVar96);
  auVar92 = vandps_avx(ZEXT1632(auVar74),auVar108);
  auVar110._8_4_ = 0x219392ef;
  auVar110._0_8_ = 0x219392ef219392ef;
  auVar110._12_4_ = 0x219392ef;
  auVar110._16_4_ = 0x219392ef;
  auVar110._20_4_ = 0x219392ef;
  auVar110._24_4_ = 0x219392ef;
  auVar110._28_4_ = 0x219392ef;
  uVar72 = vcmpps_avx512vl(auVar92,auVar110,1);
  bVar67 = (bool)((byte)uVar72 & 1);
  auVar89._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar74._0_4_;
  bVar67 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar74._4_4_;
  bVar67 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar74._8_4_;
  bVar67 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar74._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar92 = vandps_avx(ZEXT1632(auVar16),auVar108);
  uVar72 = vcmpps_avx512vl(auVar92,auVar110,1);
  bVar67 = (bool)((byte)uVar72 & 1);
  auVar102._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar16._0_4_;
  bVar67 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar16._4_4_;
  bVar67 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar16._8_4_;
  bVar67 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar16._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar92 = vandps_avx(ZEXT1632(auVar76),auVar108);
  uVar72 = vcmpps_avx512vl(auVar92,auVar110,1);
  bVar67 = (bool)((byte)uVar72 & 1);
  auVar92._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar76._0_4_;
  bVar67 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar76._4_4_;
  bVar67 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar76._8_4_;
  bVar67 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar76._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar91 = vrcp14ps_avx512vl(auVar89);
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = 0x3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar109._16_4_ = 0x3f800000;
  auVar109._20_4_ = 0x3f800000;
  auVar109._24_4_ = 0x3f800000;
  auVar109._28_4_ = 0x3f800000;
  auVar74 = vfnmadd213ps_fma(auVar89,auVar91,auVar109);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar102);
  auVar16 = vfnmadd213ps_fma(auVar102,auVar91,auVar109);
  auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar92);
  auVar76 = vfnmadd213ps_fma(auVar92,auVar91,auVar109);
  auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar91,auVar91);
  fVar212 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar61 + 0x16)) *
            *(float *)(prim + lVar61 + 0x1a);
  auVar107._4_4_ = fVar212;
  auVar107._0_4_ = fVar212;
  auVar107._8_4_ = fVar212;
  auVar107._12_4_ = fVar212;
  auVar107._16_4_ = fVar212;
  auVar107._20_4_ = fVar212;
  auVar107._24_4_ = fVar212;
  auVar107._28_4_ = fVar212;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 7 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 0xb + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 9 + 6));
  auVar77 = vfmadd213ps_fma(auVar91,auVar107,auVar92);
  auVar92 = vcvtdq2ps_avx(auVar18);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 0xd + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar78 = vfmadd213ps_fma(auVar91,auVar107,auVar92);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 0x12 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar72 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 2 + uVar72 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar83 = vfmadd213ps_fma(auVar91,auVar107,auVar92);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 0x18 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar79 = vfmadd213ps_fma(auVar91,auVar107,auVar92);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 0x1d + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 + (ulong)(byte)PVar2 * 0x20 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar75 = vfmadd213ps_fma(auVar91,auVar107,auVar92);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar2 * 0x20 - uVar59) + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 0x23 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar92);
  auVar80 = vfmadd213ps_fma(auVar91,auVar107,auVar92);
  auVar92 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar81));
  auVar96._4_4_ = auVar74._4_4_ * auVar92._4_4_;
  auVar96._0_4_ = auVar74._0_4_ * auVar92._0_4_;
  auVar96._8_4_ = auVar74._8_4_ * auVar92._8_4_;
  auVar96._12_4_ = auVar74._12_4_ * auVar92._12_4_;
  auVar96._16_4_ = auVar92._16_4_ * 0.0;
  auVar96._20_4_ = auVar92._20_4_ * 0.0;
  auVar96._24_4_ = auVar92._24_4_ * 0.0;
  auVar96._28_4_ = auVar92._28_4_;
  auVar92 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar81));
  auVar105._0_4_ = auVar74._0_4_ * auVar92._0_4_;
  auVar105._4_4_ = auVar74._4_4_ * auVar92._4_4_;
  auVar105._8_4_ = auVar74._8_4_ * auVar92._8_4_;
  auVar105._12_4_ = auVar74._12_4_ * auVar92._12_4_;
  auVar105._16_4_ = auVar92._16_4_ * 0.0;
  auVar105._20_4_ = auVar92._20_4_ * 0.0;
  auVar105._24_4_ = auVar92._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar92 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar84));
  auVar97._4_4_ = auVar16._4_4_ * auVar92._4_4_;
  auVar97._0_4_ = auVar16._0_4_ * auVar92._0_4_;
  auVar97._8_4_ = auVar16._8_4_ * auVar92._8_4_;
  auVar97._12_4_ = auVar16._12_4_ * auVar92._12_4_;
  auVar97._16_4_ = auVar92._16_4_ * 0.0;
  auVar97._20_4_ = auVar92._20_4_ * 0.0;
  auVar97._24_4_ = auVar92._24_4_ * 0.0;
  auVar97._28_4_ = auVar92._28_4_;
  auVar92 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar84));
  auVar104._0_4_ = auVar16._0_4_ * auVar92._0_4_;
  auVar104._4_4_ = auVar16._4_4_ * auVar92._4_4_;
  auVar104._8_4_ = auVar16._8_4_ * auVar92._8_4_;
  auVar104._12_4_ = auVar16._12_4_ * auVar92._12_4_;
  auVar104._16_4_ = auVar92._16_4_ * 0.0;
  auVar104._20_4_ = auVar92._20_4_ * 0.0;
  auVar104._24_4_ = auVar92._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar92 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar85));
  auVar98._4_4_ = auVar76._4_4_ * auVar92._4_4_;
  auVar98._0_4_ = auVar76._0_4_ * auVar92._0_4_;
  auVar98._8_4_ = auVar76._8_4_ * auVar92._8_4_;
  auVar98._12_4_ = auVar76._12_4_ * auVar92._12_4_;
  auVar98._16_4_ = auVar92._16_4_ * 0.0;
  auVar98._20_4_ = auVar92._20_4_ * 0.0;
  auVar98._24_4_ = auVar92._24_4_ * 0.0;
  auVar98._28_4_ = auVar92._28_4_;
  auVar92 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar85));
  auVar103._0_4_ = auVar76._0_4_ * auVar92._0_4_;
  auVar103._4_4_ = auVar76._4_4_ * auVar92._4_4_;
  auVar103._8_4_ = auVar76._8_4_ * auVar92._8_4_;
  auVar103._12_4_ = auVar76._12_4_ * auVar92._12_4_;
  auVar103._16_4_ = auVar92._16_4_ * 0.0;
  auVar103._20_4_ = auVar92._20_4_ * 0.0;
  auVar103._24_4_ = auVar92._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar92 = vpminsd_avx2(auVar96,auVar105);
  auVar91 = vpminsd_avx2(auVar97,auVar104);
  auVar92 = vmaxps_avx(auVar92,auVar91);
  auVar91 = vpminsd_avx2(auVar98,auVar103);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar18._4_4_ = uVar166;
  auVar18._0_4_ = uVar166;
  auVar18._8_4_ = uVar166;
  auVar18._12_4_ = uVar166;
  auVar18._16_4_ = uVar166;
  auVar18._20_4_ = uVar166;
  auVar18._24_4_ = uVar166;
  auVar18._28_4_ = uVar166;
  auVar91 = vmaxps_avx512vl(auVar91,auVar18);
  auVar92 = vmaxps_avx(auVar92,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_5e0 = vmulps_avx512vl(auVar92,auVar91);
  auVar92 = vpmaxsd_avx2(auVar96,auVar105);
  auVar91 = vpmaxsd_avx2(auVar97,auVar104);
  auVar92 = vminps_avx(auVar92,auVar91);
  auVar91 = vpmaxsd_avx2(auVar98,auVar103);
  uVar166 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar93._4_4_ = uVar166;
  auVar93._0_4_ = uVar166;
  auVar93._8_4_ = uVar166;
  auVar93._12_4_ = uVar166;
  auVar93._16_4_ = uVar166;
  auVar93._20_4_ = uVar166;
  auVar93._24_4_ = uVar166;
  auVar93._28_4_ = uVar166;
  auVar91 = vminps_avx512vl(auVar91,auVar93);
  auVar92 = vminps_avx(auVar92,auVar91);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar94._16_4_ = 0x3f800003;
  auVar94._20_4_ = 0x3f800003;
  auVar94._24_4_ = 0x3f800003;
  auVar94._28_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar94);
  auVar91 = vpbroadcastd_avx512vl();
  uVar20 = vpcmpgtd_avx512vl(auVar91,_DAT_01fe9900);
  uVar19 = vcmpps_avx512vl(local_5e0,auVar92,2);
  if ((byte)((byte)uVar19 & (byte)uVar20) == 0) {
    return false;
  }
  local_908 = (ulong)(byte)((byte)uVar19 & (byte)uVar20);
  auVar163 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar163);
  local_910 = prim;
LAB_01e3f3cd:
  lVar61 = 0;
  for (uVar72 = local_908; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
    lVar61 = lVar61 + 1;
  }
  uVar60 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar60].ptr;
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(prim + lVar61 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar212 = (pGVar3->time_range).lower;
  fVar212 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar212) / ((pGVar3->time_range).upper - fVar212));
  auVar74 = vroundss_avx(ZEXT416((uint)fVar212),ZEXT416((uint)fVar212),9);
  auVar74 = vminss_avx(auVar74,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar74 = vmaxss_avx(ZEXT816(0) << 0x20,auVar74);
  fVar212 = fVar212 - auVar74._0_4_;
  fVar150 = 1.0 - fVar212;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar68 = (long)(int)auVar74._0_4_ * 0x38;
  lVar5 = *(long *)(_Var4 + 0x10 + lVar68);
  lVar6 = *(long *)(_Var4 + 0x38 + lVar68);
  lVar7 = *(long *)(_Var4 + 0x48 + lVar68);
  pfVar1 = (float *)(lVar6 + lVar7 * uVar72);
  auVar84._0_4_ = fVar212 * *pfVar1;
  auVar84._4_4_ = fVar212 * pfVar1[1];
  auVar84._8_4_ = fVar212 * pfVar1[2];
  auVar84._12_4_ = fVar212 * pfVar1[3];
  lVar61 = uVar72 + 1;
  pfVar1 = (float *)(lVar6 + lVar7 * lVar61);
  auVar85._0_4_ = fVar212 * *pfVar1;
  auVar85._4_4_ = fVar212 * pfVar1[1];
  auVar85._8_4_ = fVar212 * pfVar1[2];
  auVar85._12_4_ = fVar212 * pfVar1[3];
  p_Var8 = pGVar3[4].occlusionFilterN;
  auVar87._4_4_ = fVar150;
  auVar87._0_4_ = fVar150;
  auVar87._8_4_ = fVar150;
  auVar87._12_4_ = fVar150;
  auVar77 = vfmadd231ps_fma(auVar84,auVar87,
                            *(undefined1 (*) [16])(*(long *)(_Var4 + lVar68) + lVar5 * uVar72));
  auVar78 = vfmadd231ps_fma(auVar85,auVar87,
                            *(undefined1 (*) [16])(*(long *)(_Var4 + lVar68) + lVar5 * lVar61));
  pfVar1 = (float *)(*(long *)(p_Var8 + lVar68 + 0x38) + uVar72 * *(long *)(p_Var8 + lVar68 + 0x48))
  ;
  auVar82._0_4_ = fVar212 * *pfVar1;
  auVar82._4_4_ = fVar212 * pfVar1[1];
  auVar82._8_4_ = fVar212 * pfVar1[2];
  auVar82._12_4_ = fVar212 * pfVar1[3];
  pfVar1 = (float *)(*(long *)(p_Var8 + lVar68 + 0x38) + *(long *)(p_Var8 + lVar68 + 0x48) * lVar61)
  ;
  auVar86._0_4_ = fVar212 * *pfVar1;
  auVar86._4_4_ = fVar212 * pfVar1[1];
  auVar86._8_4_ = fVar212 * pfVar1[2];
  auVar86._12_4_ = fVar212 * pfVar1[3];
  auVar76 = vfmadd231ps_fma(auVar82,auVar87,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var8 + lVar68) +
                             *(long *)(p_Var8 + lVar68 + 0x10) * uVar72));
  auVar83 = vfmadd231ps_fma(auVar86,auVar87,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var8 + lVar68) +
                             *(long *)(p_Var8 + lVar68 + 0x10) * lVar61));
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar16 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  _local_760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar74 = vunpcklps_avx512vl(local_760._0_16_,local_780._0_16_);
  local_860 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar80 = local_860._0_16_;
  local_9b0 = vinsertps_avx512f(auVar74,auVar80,0x28);
  auVar231._8_4_ = 0xbeaaaaab;
  auVar231._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar231._12_4_ = 0xbeaaaaab;
  auVar79 = vfnmadd213ps_fma(auVar76,auVar231,auVar77);
  auVar76 = vfmadd213ps_fma(auVar83,auVar231,auVar78);
  auVar232._0_4_ = auVar78._0_4_ + auVar77._0_4_ + auVar79._0_4_ + auVar76._0_4_;
  auVar232._4_4_ = auVar78._4_4_ + auVar77._4_4_ + auVar79._4_4_ + auVar76._4_4_;
  auVar232._8_4_ = auVar78._8_4_ + auVar77._8_4_ + auVar79._8_4_ + auVar76._8_4_;
  auVar232._12_4_ = auVar78._12_4_ + auVar77._12_4_ + auVar79._12_4_ + auVar76._12_4_;
  auVar81._8_4_ = 0x3e800000;
  auVar81._0_8_ = 0x3e8000003e800000;
  auVar81._12_4_ = 0x3e800000;
  auVar74 = vmulps_avx512vl(auVar232,auVar81);
  auVar74 = vsubps_avx(auVar74,auVar16);
  auVar74 = vdpps_avx(auVar74,local_9b0,0x7f);
  fVar212 = *(float *)(ray + k * 4 + 0xc0);
  local_9c0 = vdpps_avx(local_9b0,local_9b0,0x7f);
  auVar163 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar163);
  auVar240._4_12_ = ZEXT812(0) << 0x20;
  auVar240._0_4_ = local_9c0._0_4_;
  auVar75 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar240);
  auVar83 = vfnmadd213ss_fma(auVar75,local_9c0,ZEXT416(0x40000000));
  fVar150 = auVar74._0_4_ * auVar75._0_4_ * auVar83._0_4_;
  auVar241._4_4_ = fVar150;
  auVar241._0_4_ = fVar150;
  auVar241._8_4_ = fVar150;
  auVar241._12_4_ = fVar150;
  auVar74 = vfmadd231ps_fma(auVar16,local_9b0,auVar241);
  auVar74 = vblendps_avx(auVar74,ZEXT816(0) << 0x40,8);
  auVar16 = vsubps_avx(auVar77,auVar74);
  auVar76 = vsubps_avx(auVar76,auVar74);
  auVar77 = vsubps_avx(auVar79,auVar74);
  auVar74 = vsubps_avx(auVar78,auVar74);
  uVar166 = auVar16._0_4_;
  auVar250._4_4_ = uVar166;
  auVar250._0_4_ = uVar166;
  auVar250._8_4_ = uVar166;
  auVar250._12_4_ = uVar166;
  auVar250._16_4_ = uVar166;
  auVar250._20_4_ = uVar166;
  auVar250._24_4_ = uVar166;
  auVar250._28_4_ = uVar166;
  auVar114._8_4_ = 1;
  auVar114._0_8_ = 0x100000001;
  auVar114._12_4_ = 1;
  auVar114._16_4_ = 1;
  auVar114._20_4_ = 1;
  auVar114._24_4_ = 1;
  auVar114._28_4_ = 1;
  local_880 = ZEXT1632(auVar16);
  auVar92 = vpermps_avx2(auVar114,local_880);
  auVar115._8_4_ = 2;
  auVar115._0_8_ = 0x200000002;
  auVar115._12_4_ = 2;
  auVar115._16_4_ = 2;
  auVar115._20_4_ = 2;
  auVar115._24_4_ = 2;
  auVar115._28_4_ = 2;
  auVar91 = vpermps_avx2(auVar115,local_880);
  auVar116._8_4_ = 3;
  auVar116._0_8_ = 0x300000003;
  auVar116._12_4_ = 3;
  auVar116._16_4_ = 3;
  auVar116._20_4_ = 3;
  auVar116._24_4_ = 3;
  auVar116._28_4_ = 3;
  auVar18 = vpermps_avx2(auVar116,local_880);
  uVar166 = auVar77._0_4_;
  local_5a0._4_4_ = uVar166;
  local_5a0._0_4_ = uVar166;
  local_5a0._8_4_ = uVar166;
  local_5a0._12_4_ = uVar166;
  local_5a0._16_4_ = uVar166;
  local_5a0._20_4_ = uVar166;
  local_5a0._24_4_ = uVar166;
  local_5a0._28_4_ = uVar166;
  local_8c0 = ZEXT1632(auVar77);
  local_900 = vpermps_avx2(auVar114,local_8c0);
  auVar93 = vpermps_avx512vl(auVar115,local_8c0);
  auVar94 = vpermps_avx512vl(auVar116,local_8c0);
  auVar95 = vbroadcastss_avx512vl(auVar76);
  local_8a0 = ZEXT1632(auVar76);
  auVar96 = vpermps_avx512vl(auVar114,local_8a0);
  auVar97 = vpermps_avx512vl(auVar115,local_8a0);
  auVar98 = vpermps_avx512vl(auVar116,local_8a0);
  auVar99 = vbroadcastss_avx512vl(auVar74);
  _local_8e0 = ZEXT1632(auVar74);
  auVar90 = vpermps_avx512vl(auVar114,_local_8e0);
  auVar100 = vpermps_avx512vl(auVar115,_local_8e0);
  auVar101 = vpermps_avx512vl(auVar116,_local_8e0);
  auVar230 = ZEXT3264(local_900);
  auVar74 = vmulss_avx512f(auVar80,auVar80);
  auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),local_780,local_780);
  local_580 = vfmadd231ps_avx512vl(auVar88,_local_760,_local_760);
  local_560._0_4_ = local_580._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar113._8_4_ = 0x7fffffff;
  auVar113._0_8_ = 0x7fffffff7fffffff;
  auVar113._12_4_ = 0x7fffffff;
  auVar113._16_4_ = 0x7fffffff;
  auVar113._20_4_ = 0x7fffffff;
  auVar113._24_4_ = 0x7fffffff;
  auVar113._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar113);
  local_970 = ZEXT416((uint)fVar150);
  local_5c0 = fVar212 - fVar150;
  fStack_5bc = local_5c0;
  fStack_5b8 = local_5c0;
  fStack_5b4 = local_5c0;
  fStack_5b0 = local_5c0;
  fStack_5ac = local_5c0;
  fStack_5a8 = local_5c0;
  fStack_5a4 = local_5c0;
  uVar63 = 0;
  bVar67 = false;
  iVar65 = 1;
  auVar163 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar163);
  auVar74 = vsqrtss_avx(local_9c0,local_9c0);
  auVar16 = vsqrtss_avx(local_9c0,local_9c0);
  local_980 = ZEXT816(0x3f80000000000000);
  auVar163 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  do {
    auVar76 = vmovshdup_avx(local_980);
    auVar76 = vsubps_avx(auVar76,local_980);
    fVar165 = auVar76._0_4_;
    fVar182 = fVar165 * 0.04761905;
    auVar223._0_4_ = local_980._0_4_;
    auVar223._4_4_ = auVar223._0_4_;
    auVar223._8_4_ = auVar223._0_4_;
    auVar223._12_4_ = auVar223._0_4_;
    auVar223._16_4_ = auVar223._0_4_;
    auVar223._20_4_ = auVar223._0_4_;
    auVar223._24_4_ = auVar223._0_4_;
    auVar223._28_4_ = auVar223._0_4_;
    auVar248._4_4_ = fVar165;
    auVar248._0_4_ = fVar165;
    auVar248._8_4_ = fVar165;
    auVar248._12_4_ = fVar165;
    auVar248._16_4_ = fVar165;
    auVar248._20_4_ = fVar165;
    auVar248._24_4_ = fVar165;
    auVar248._28_4_ = fVar165;
    auVar76 = vfmadd231ps_fma(auVar223,auVar248,_DAT_01faff20);
    auVar237 = auVar163._0_32_;
    auVar88 = vsubps_avx(auVar237,ZEXT1632(auVar76));
    fVar165 = auVar76._0_4_;
    fVar178 = auVar76._4_4_;
    auVar130._4_4_ = local_5a0._4_4_ * fVar178;
    auVar130._0_4_ = local_5a0._0_4_ * fVar165;
    fVar179 = auVar76._8_4_;
    auVar130._8_4_ = local_5a0._8_4_ * fVar179;
    fVar180 = auVar76._12_4_;
    auVar130._12_4_ = local_5a0._12_4_ * fVar180;
    auVar130._16_4_ = local_5a0._16_4_ * 0.0;
    auVar130._20_4_ = local_5a0._20_4_ * 0.0;
    auVar130._24_4_ = local_5a0._24_4_ * 0.0;
    auVar130._28_4_ = DAT_01faff20._28_4_;
    auVar103 = ZEXT1632(auVar76);
    auVar122._4_4_ = auVar230._4_4_ * fVar178;
    auVar122._0_4_ = auVar230._0_4_ * fVar165;
    auVar122._8_4_ = auVar230._8_4_ * fVar179;
    auVar122._12_4_ = auVar230._12_4_ * fVar180;
    auVar122._16_4_ = auVar230._16_4_ * 0.0;
    auVar122._20_4_ = auVar230._20_4_ * 0.0;
    auVar122._24_4_ = auVar230._24_4_ * 0.0;
    auVar122._28_4_ = auVar223._0_4_;
    auVar89 = vmulps_avx512vl(auVar93,auVar103);
    auVar102 = vmulps_avx512vl(auVar94,auVar103);
    auVar77 = vfmadd231ps_fma(auVar130,auVar88,auVar250);
    auVar78 = vfmadd231ps_fma(auVar122,auVar88,auVar92);
    auVar83 = vfmadd231ps_fma(auVar89,auVar88,auVar91);
    auVar79 = vfmadd231ps_fma(auVar102,auVar88,auVar18);
    auVar89 = vmulps_avx512vl(auVar95,auVar103);
    auVar107 = ZEXT1632(auVar76);
    auVar102 = vmulps_avx512vl(auVar96,auVar107);
    auVar103 = vmulps_avx512vl(auVar97,auVar107);
    auVar104 = vmulps_avx512vl(auVar98,auVar107);
    auVar75 = vfmadd231ps_fma(auVar89,auVar88,local_5a0);
    auVar80 = vfmadd231ps_fma(auVar102,auVar88,auVar230._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar103,auVar88,auVar93);
    auVar102 = vfmadd231ps_avx512vl(auVar104,auVar88,auVar94);
    auVar103 = vmulps_avx512vl(auVar99,auVar107);
    auVar104 = vmulps_avx512vl(auVar90,auVar107);
    auVar105 = vmulps_avx512vl(auVar100,auVar107);
    auVar106 = vmulps_avx512vl(auVar101,auVar107);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar88,auVar95);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar88,auVar96);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar88,auVar97);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar88,auVar98);
    auVar256._0_28_ =
         ZEXT1628(CONCAT412(fVar180 * auVar75._12_4_,
                            CONCAT48(fVar179 * auVar75._8_4_,
                                     CONCAT44(fVar178 * auVar75._4_4_,fVar165 * auVar75._0_4_))));
    auVar107 = vmulps_avx512vl(auVar107,ZEXT1632(auVar80));
    auVar108 = vmulps_avx512vl(ZEXT1632(auVar76),auVar89);
    auVar109 = vmulps_avx512vl(ZEXT1632(auVar76),auVar102);
    auVar76 = vfmadd231ps_fma(auVar256._0_32_,auVar88,ZEXT1632(auVar77));
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar88,ZEXT1632(auVar78));
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar88,ZEXT1632(auVar83));
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar88,ZEXT1632(auVar79));
    auVar244._0_4_ = auVar103._0_4_ * fVar165;
    auVar244._4_4_ = auVar103._4_4_ * fVar178;
    auVar244._8_4_ = auVar103._8_4_ * fVar179;
    auVar244._12_4_ = auVar103._12_4_ * fVar180;
    auVar244._16_4_ = auVar103._16_4_ * 0.0;
    auVar244._20_4_ = auVar103._20_4_ * 0.0;
    auVar244._24_4_ = auVar103._24_4_ * 0.0;
    auVar244._28_4_ = 0;
    auVar123._4_4_ = auVar104._4_4_ * fVar178;
    auVar123._0_4_ = auVar104._0_4_ * fVar165;
    auVar123._8_4_ = auVar104._8_4_ * fVar179;
    auVar123._12_4_ = auVar104._12_4_ * fVar180;
    auVar123._16_4_ = auVar104._16_4_ * 0.0;
    auVar123._20_4_ = auVar104._20_4_ * 0.0;
    auVar123._24_4_ = auVar104._24_4_ * 0.0;
    auVar123._28_4_ = auVar103._28_4_;
    auVar228._4_4_ = auVar105._4_4_ * fVar178;
    auVar228._0_4_ = auVar105._0_4_ * fVar165;
    auVar228._8_4_ = auVar105._8_4_ * fVar179;
    auVar228._12_4_ = auVar105._12_4_ * fVar180;
    auVar228._16_4_ = auVar105._16_4_ * 0.0;
    auVar228._20_4_ = auVar105._20_4_ * 0.0;
    auVar228._24_4_ = auVar105._24_4_ * 0.0;
    auVar228._28_4_ = auVar104._28_4_;
    auVar124._4_4_ = auVar106._4_4_ * fVar178;
    auVar124._0_4_ = auVar106._0_4_ * fVar165;
    auVar124._8_4_ = auVar106._8_4_ * fVar179;
    auVar124._12_4_ = auVar106._12_4_ * fVar180;
    auVar124._16_4_ = auVar106._16_4_ * 0.0;
    auVar124._20_4_ = auVar106._20_4_ * 0.0;
    auVar124._24_4_ = auVar106._24_4_ * 0.0;
    auVar124._28_4_ = auVar105._28_4_;
    auVar77 = vfmadd231ps_fma(auVar244,auVar88,ZEXT1632(auVar75));
    auVar78 = vfmadd231ps_fma(auVar123,auVar88,ZEXT1632(auVar80));
    auVar83 = vfmadd231ps_fma(auVar228,auVar88,auVar89);
    auVar79 = vfmadd231ps_fma(auVar124,auVar88,auVar102);
    auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar180 * auVar77._12_4_,
                                                 CONCAT48(fVar179 * auVar77._8_4_,
                                                          CONCAT44(fVar178 * auVar77._4_4_,
                                                                   fVar165 * auVar77._0_4_)))),
                              auVar88,ZEXT1632(auVar76));
    auVar105 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar78._12_4_ * fVar180,
                                             CONCAT48(auVar78._8_4_ * fVar179,
                                                      CONCAT44(auVar78._4_4_ * fVar178,
                                                               auVar78._0_4_ * fVar165)))),auVar88,
                          auVar107);
    auVar110 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar83._12_4_ * fVar180,
                                             CONCAT48(auVar83._8_4_ * fVar179,
                                                      CONCAT44(auVar83._4_4_ * fVar178,
                                                               auVar83._0_4_ * fVar165)))),auVar88,
                          auVar108);
    auVar89 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar79._12_4_ * fVar180,
                                            CONCAT48(auVar79._8_4_ * fVar179,
                                                     CONCAT44(auVar79._4_4_ * fVar178,
                                                              auVar79._0_4_ * fVar165)))),auVar109,
                         auVar88);
    auVar88 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar76));
    auVar102 = vsubps_avx512vl(ZEXT1632(auVar78),auVar107);
    auVar103 = vsubps_avx512vl(ZEXT1632(auVar83),auVar108);
    auVar104 = vsubps_avx512vl(ZEXT1632(auVar79),auVar109);
    auVar254._0_4_ = fVar182 * auVar88._0_4_ * 3.0;
    auVar254._4_4_ = fVar182 * auVar88._4_4_ * 3.0;
    auVar254._8_4_ = fVar182 * auVar88._8_4_ * 3.0;
    auVar254._12_4_ = fVar182 * auVar88._12_4_ * 3.0;
    auVar254._16_4_ = fVar182 * auVar88._16_4_ * 3.0;
    auVar254._20_4_ = fVar182 * auVar88._20_4_ * 3.0;
    auVar254._24_4_ = fVar182 * auVar88._24_4_ * 3.0;
    auVar254._28_4_ = 0;
    auVar255._0_4_ = fVar182 * auVar102._0_4_ * 3.0;
    auVar255._4_4_ = fVar182 * auVar102._4_4_ * 3.0;
    auVar255._8_4_ = fVar182 * auVar102._8_4_ * 3.0;
    auVar255._12_4_ = fVar182 * auVar102._12_4_ * 3.0;
    auVar255._16_4_ = fVar182 * auVar102._16_4_ * 3.0;
    auVar255._20_4_ = fVar182 * auVar102._20_4_ * 3.0;
    auVar255._24_4_ = fVar182 * auVar102._24_4_ * 3.0;
    auVar255._28_4_ = 0;
    auVar129._4_4_ = fVar182 * auVar103._4_4_ * 3.0;
    auVar129._0_4_ = fVar182 * auVar103._0_4_ * 3.0;
    auVar129._8_4_ = fVar182 * auVar103._8_4_ * 3.0;
    auVar129._12_4_ = fVar182 * auVar103._12_4_ * 3.0;
    auVar129._16_4_ = fVar182 * auVar103._16_4_ * 3.0;
    auVar129._20_4_ = fVar182 * auVar103._20_4_ * 3.0;
    auVar129._24_4_ = fVar182 * auVar103._24_4_ * 3.0;
    auVar129._28_4_ = auVar106._28_4_;
    fVar165 = auVar104._0_4_ * 3.0 * fVar182;
    fVar178 = auVar104._4_4_ * 3.0 * fVar182;
    auVar125._4_4_ = fVar178;
    auVar125._0_4_ = fVar165;
    fVar179 = auVar104._8_4_ * 3.0 * fVar182;
    auVar125._8_4_ = fVar179;
    fVar180 = auVar104._12_4_ * 3.0 * fVar182;
    auVar125._12_4_ = fVar180;
    fVar181 = auVar104._16_4_ * 3.0 * fVar182;
    auVar125._16_4_ = fVar181;
    fVar183 = auVar104._20_4_ * 3.0 * fVar182;
    auVar125._20_4_ = fVar183;
    fVar211 = auVar104._24_4_ * 3.0 * fVar182;
    auVar125._24_4_ = fVar211;
    auVar125._28_4_ = fVar182;
    auVar76 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar76);
    auVar106 = vpermt2ps_avx512vl(ZEXT1632(auVar75),_DAT_01feed00,ZEXT1632(auVar76));
    auVar107 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,ZEXT1632(auVar76));
    auVar102 = ZEXT1632(auVar76);
    auVar108 = vpermt2ps_avx512vl(auVar110,_DAT_01feed00,auVar102);
    auVar238._0_4_ = auVar89._0_4_ + fVar165;
    auVar238._4_4_ = auVar89._4_4_ + fVar178;
    auVar238._8_4_ = auVar89._8_4_ + fVar179;
    auVar238._12_4_ = auVar89._12_4_ + fVar180;
    auVar238._16_4_ = auVar89._16_4_ + fVar181;
    auVar238._20_4_ = auVar89._20_4_ + fVar183;
    auVar238._24_4_ = auVar89._24_4_ + fVar211;
    auVar238._28_4_ = auVar89._28_4_ + fVar182;
    auVar88 = vmaxps_avx(auVar89,auVar238);
    auVar109 = vminps_avx512vl(auVar89,auVar238);
    auVar111 = vpermt2ps_avx512vl(auVar89,_DAT_01feed00,auVar102);
    auVar112 = vpermt2ps_avx512vl(auVar254,_DAT_01feed00,auVar102);
    auVar113 = vpermt2ps_avx512vl(auVar255,_DAT_01feed00,auVar102);
    auVar124 = ZEXT1632(auVar76);
    auVar114 = vpermt2ps_avx512vl(auVar129,_DAT_01feed00,auVar124);
    auVar89 = vpermt2ps_avx512vl(auVar125,_DAT_01feed00,auVar124);
    auVar89 = vsubps_avx(auVar111,auVar89);
    auVar102 = vsubps_avx(auVar106,ZEXT1632(auVar75));
    auVar103 = vsubps_avx(auVar107,auVar105);
    auVar104 = vsubps_avx(auVar108,auVar110);
    auVar115 = vmulps_avx512vl(auVar103,auVar129);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar255,auVar104);
    auVar116 = vmulps_avx512vl(auVar104,auVar254);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar129,auVar102);
    auVar117 = vmulps_avx512vl(auVar102,auVar255);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar254,auVar103);
    auVar117 = vmulps_avx512vl(auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar116 = vmulps_avx512vl(auVar104,auVar104);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar103,auVar103);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar102,auVar102);
    auVar117 = vrcp14ps_avx512vl(auVar116);
    auVar118 = vfnmadd213ps_avx512vl(auVar117,auVar116,auVar237);
    auVar117 = vfmadd132ps_avx512vl(auVar118,auVar117,auVar117);
    auVar115 = vmulps_avx512vl(auVar115,auVar117);
    auVar118 = vmulps_avx512vl(auVar103,auVar114);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar113,auVar104);
    auVar119 = vmulps_avx512vl(auVar104,auVar112);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar114,auVar102);
    auVar120 = vmulps_avx512vl(auVar102,auVar113);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar112,auVar103);
    auVar120 = vmulps_avx512vl(auVar120,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar117 = vmulps_avx512vl(auVar118,auVar117);
    auVar115 = vmaxps_avx512vl(auVar115,auVar117);
    auVar115 = vsqrtps_avx512vl(auVar115);
    auVar117 = vmaxps_avx512vl(auVar89,auVar111);
    auVar88 = vmaxps_avx512vl(auVar88,auVar117);
    auVar120 = vaddps_avx512vl(auVar115,auVar88);
    auVar88 = vminps_avx(auVar89,auVar111);
    auVar88 = vminps_avx512vl(auVar109,auVar88);
    auVar88 = vsubps_avx512vl(auVar88,auVar115);
    auVar117._8_4_ = 0x3f800002;
    auVar117._0_8_ = 0x3f8000023f800002;
    auVar117._12_4_ = 0x3f800002;
    auVar117._16_4_ = 0x3f800002;
    auVar117._20_4_ = 0x3f800002;
    auVar117._24_4_ = 0x3f800002;
    auVar117._28_4_ = 0x3f800002;
    auVar89 = vmulps_avx512vl(auVar120,auVar117);
    auVar118._8_4_ = 0x3f7ffffc;
    auVar118._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar118._12_4_ = 0x3f7ffffc;
    auVar118._16_4_ = 0x3f7ffffc;
    auVar118._20_4_ = 0x3f7ffffc;
    auVar118._24_4_ = 0x3f7ffffc;
    auVar118._28_4_ = 0x3f7ffffc;
    auVar88 = vmulps_avx512vl(auVar88,auVar118);
    auVar89 = vmulps_avx512vl(auVar89,auVar89);
    auVar109 = vrsqrt14ps_avx512vl(auVar116);
    auVar119._8_4_ = 0xbf000000;
    auVar119._0_8_ = 0xbf000000bf000000;
    auVar119._12_4_ = 0xbf000000;
    auVar119._16_4_ = 0xbf000000;
    auVar119._20_4_ = 0xbf000000;
    auVar119._24_4_ = 0xbf000000;
    auVar119._28_4_ = 0xbf000000;
    auVar111 = vmulps_avx512vl(auVar116,auVar119);
    fVar165 = auVar109._0_4_;
    fVar178 = auVar109._4_4_;
    fVar179 = auVar109._8_4_;
    fVar180 = auVar109._12_4_;
    fVar182 = auVar109._16_4_;
    fVar181 = auVar109._20_4_;
    fVar183 = auVar109._24_4_;
    auVar126._4_4_ = fVar178 * fVar178 * fVar178 * auVar111._4_4_;
    auVar126._0_4_ = fVar165 * fVar165 * fVar165 * auVar111._0_4_;
    auVar126._8_4_ = fVar179 * fVar179 * fVar179 * auVar111._8_4_;
    auVar126._12_4_ = fVar180 * fVar180 * fVar180 * auVar111._12_4_;
    auVar126._16_4_ = fVar182 * fVar182 * fVar182 * auVar111._16_4_;
    auVar126._20_4_ = fVar181 * fVar181 * fVar181 * auVar111._20_4_;
    auVar126._24_4_ = fVar183 * fVar183 * fVar183 * auVar111._24_4_;
    auVar126._28_4_ = auVar120._28_4_;
    auVar120._8_4_ = 0x3fc00000;
    auVar120._0_8_ = 0x3fc000003fc00000;
    auVar120._12_4_ = 0x3fc00000;
    auVar120._16_4_ = 0x3fc00000;
    auVar120._20_4_ = 0x3fc00000;
    auVar120._24_4_ = 0x3fc00000;
    auVar120._28_4_ = 0x3fc00000;
    auVar109 = vfmadd231ps_avx512vl(auVar126,auVar109,auVar120);
    auVar256 = ZEXT3264(auVar109);
    auVar111 = vmulps_avx512vl(auVar102,auVar109);
    auVar115 = vmulps_avx512vl(auVar103,auVar109);
    auVar116 = vmulps_avx512vl(auVar104,auVar109);
    auVar228 = ZEXT1632(auVar75);
    auVar117 = vsubps_avx512vl(auVar124,auVar228);
    auVar118 = vsubps_avx512vl(auVar124,auVar105);
    auVar119 = vsubps_avx512vl(auVar124,auVar110);
    auVar120 = vmulps_avx512vl(local_860,auVar119);
    auVar120 = vfmadd231ps_avx512vl(auVar120,local_780,auVar118);
    auVar120 = vfmadd231ps_avx512vl(auVar120,_local_760,auVar117);
    auVar121 = vmulps_avx512vl(auVar119,auVar119);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar118,auVar118);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar117,auVar117);
    auVar122 = vmulps_avx512vl(local_860,auVar116);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar115,local_780);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar111,_local_760);
    auVar116 = vmulps_avx512vl(auVar119,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar118,auVar115);
    auVar111 = vfmadd231ps_avx512vl(auVar115,auVar117,auVar111);
    auVar115 = vmulps_avx512vl(auVar122,auVar122);
    auVar116 = vsubps_avx512vl(local_560,auVar115);
    auVar123 = vmulps_avx512vl(auVar122,auVar111);
    auVar120 = vsubps_avx512vl(auVar120,auVar123);
    auVar120 = vaddps_avx512vl(auVar120,auVar120);
    auVar123 = vmulps_avx512vl(auVar111,auVar111);
    auVar123 = vsubps_avx512vl(auVar121,auVar123);
    auVar89 = vsubps_avx512vl(auVar123,auVar89);
    local_7a0 = vmulps_avx512vl(auVar120,auVar120);
    auVar121._8_4_ = 0x40800000;
    auVar121._0_8_ = 0x4080000040800000;
    auVar121._12_4_ = 0x40800000;
    auVar121._16_4_ = 0x40800000;
    auVar121._20_4_ = 0x40800000;
    auVar121._24_4_ = 0x40800000;
    auVar121._28_4_ = 0x40800000;
    _local_7c0 = vmulps_avx512vl(auVar116,auVar121);
    auVar121 = vmulps_avx512vl(_local_7c0,auVar89);
    auVar121 = vsubps_avx512vl(local_7a0,auVar121);
    uVar72 = vcmpps_avx512vl(auVar121,auVar124,5);
    bVar54 = (byte)uVar72;
    if (bVar54 == 0) {
      auVar163 = ZEXT3264(auVar237);
LAB_01e400bf:
      auVar230 = ZEXT3264(local_900);
    }
    else {
      local_740._0_32_ = auVar123;
      auVar121 = vsqrtps_avx512vl(auVar121);
      auVar124 = vaddps_avx512vl(auVar116,auVar116);
      local_840 = vrcp14ps_avx512vl(auVar124);
      in_ZMM31 = ZEXT3264(local_840);
      auVar125 = vfnmadd213ps_avx512vl(local_840,auVar124,auVar237);
      auVar125 = vfmadd132ps_avx512vl(auVar125,local_840,local_840);
      auVar237._8_4_ = 0x80000000;
      auVar237._0_8_ = 0x8000000080000000;
      auVar237._12_4_ = 0x80000000;
      auVar237._16_4_ = 0x80000000;
      auVar237._20_4_ = 0x80000000;
      auVar237._24_4_ = 0x80000000;
      auVar237._28_4_ = 0x80000000;
      local_7e0 = vxorps_avx512vl(auVar120,auVar237);
      auVar126 = vsubps_avx512vl(local_7e0,auVar121);
      local_9a0 = vmulps_avx512vl(auVar126,auVar125);
      auVar121 = vsubps_avx512vl(auVar121,auVar120);
      local_9e0 = vmulps_avx512vl(auVar121,auVar125);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar125 = vblendmps_avx512vl(auVar121,local_9a0);
      auVar127._0_4_ =
           (uint)(bVar54 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar121._0_4_;
      bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar70 * auVar125._4_4_ | (uint)!bVar70 * auVar121._4_4_;
      bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar70 * auVar125._8_4_ | (uint)!bVar70 * auVar121._8_4_;
      bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar70 * auVar125._12_4_ | (uint)!bVar70 * auVar121._12_4_;
      bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar70 * auVar125._16_4_ | (uint)!bVar70 * auVar121._16_4_;
      bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar70 * auVar125._20_4_ | (uint)!bVar70 * auVar121._20_4_;
      bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar70 * auVar125._24_4_ | (uint)!bVar70 * auVar121._24_4_;
      bVar70 = SUB81(uVar72 >> 7,0);
      auVar127._28_4_ = (uint)bVar70 * auVar125._28_4_ | (uint)!bVar70 * auVar121._28_4_;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar125 = vblendmps_avx512vl(auVar121,local_9e0);
      auVar128._0_4_ =
           (uint)(bVar54 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar121._0_4_;
      bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar70 * auVar125._4_4_ | (uint)!bVar70 * auVar121._4_4_;
      bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar70 * auVar125._8_4_ | (uint)!bVar70 * auVar121._8_4_;
      bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar70 * auVar125._12_4_ | (uint)!bVar70 * auVar121._12_4_;
      bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar128._16_4_ = (uint)bVar70 * auVar125._16_4_ | (uint)!bVar70 * auVar121._16_4_;
      bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar128._20_4_ = (uint)bVar70 * auVar125._20_4_ | (uint)!bVar70 * auVar121._20_4_;
      bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar128._24_4_ = (uint)bVar70 * auVar125._24_4_ | (uint)!bVar70 * auVar121._24_4_;
      bVar70 = SUB81(uVar72 >> 7,0);
      auVar128._28_4_ = (uint)bVar70 * auVar125._28_4_ | (uint)!bVar70 * auVar121._28_4_;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar115,auVar121);
      local_800 = vmaxps_avx512vl(local_580,auVar121);
      auVar33._8_4_ = 0x36000000;
      auVar33._0_8_ = 0x3600000036000000;
      auVar33._12_4_ = 0x36000000;
      auVar33._16_4_ = 0x36000000;
      auVar33._20_4_ = 0x36000000;
      auVar33._24_4_ = 0x36000000;
      auVar33._28_4_ = 0x36000000;
      local_820 = vmulps_avx512vl(local_800,auVar33);
      vandps_avx512vl(auVar116,auVar121);
      uVar59 = vcmpps_avx512vl(local_820,local_820,1);
      uVar72 = uVar72 & uVar59;
      bVar56 = (byte)uVar72;
      if (bVar56 != 0) {
        uVar59 = vcmpps_avx512vl(auVar89,_DAT_01faff00,2);
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar116 = vblendmps_avx512vl(auVar89,auVar115);
        bVar62 = (byte)uVar59;
        uVar73 = (uint)(bVar62 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar62 & 1) * local_820._0_4_;
        bVar70 = (bool)((byte)(uVar59 >> 1) & 1);
        uVar64 = (uint)bVar70 * auVar116._4_4_ | (uint)!bVar70 * local_820._4_4_;
        bVar70 = (bool)((byte)(uVar59 >> 2) & 1);
        uVar58 = (uint)bVar70 * auVar116._8_4_ | (uint)!bVar70 * local_820._8_4_;
        bVar70 = (bool)((byte)(uVar59 >> 3) & 1);
        uVar144 = (uint)bVar70 * auVar116._12_4_ | (uint)!bVar70 * local_820._12_4_;
        bVar70 = (bool)((byte)(uVar59 >> 4) & 1);
        uVar145 = (uint)bVar70 * auVar116._16_4_ | (uint)!bVar70 * local_820._16_4_;
        bVar70 = (bool)((byte)(uVar59 >> 5) & 1);
        uVar146 = (uint)bVar70 * auVar116._20_4_ | (uint)!bVar70 * local_820._20_4_;
        bVar70 = (bool)((byte)(uVar59 >> 6) & 1);
        uVar147 = (uint)bVar70 * auVar116._24_4_ | (uint)!bVar70 * local_820._24_4_;
        bVar70 = SUB81(uVar59 >> 7,0);
        uVar148 = (uint)bVar70 * auVar116._28_4_ | (uint)!bVar70 * local_820._28_4_;
        auVar127._0_4_ = (bVar56 & 1) * uVar73 | !(bool)(bVar56 & 1) * auVar127._0_4_;
        bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar127._4_4_ = bVar70 * uVar64 | !bVar70 * auVar127._4_4_;
        bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar127._8_4_ = bVar70 * uVar58 | !bVar70 * auVar127._8_4_;
        bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar127._12_4_ = bVar70 * uVar144 | !bVar70 * auVar127._12_4_;
        bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar127._16_4_ = bVar70 * uVar145 | !bVar70 * auVar127._16_4_;
        bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar127._20_4_ = bVar70 * uVar146 | !bVar70 * auVar127._20_4_;
        bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar127._24_4_ = bVar70 * uVar147 | !bVar70 * auVar127._24_4_;
        bVar70 = SUB81(uVar72 >> 7,0);
        auVar127._28_4_ = bVar70 * uVar148 | !bVar70 * auVar127._28_4_;
        auVar89 = vblendmps_avx512vl(auVar115,auVar89);
        bVar70 = (bool)((byte)(uVar59 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar59 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar59 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar59 >> 6) & 1);
        bVar14 = SUB81(uVar59 >> 7,0);
        auVar128._0_4_ =
             (uint)(bVar56 & 1) *
             ((uint)(bVar62 & 1) * auVar89._0_4_ | !(bool)(bVar62 & 1) * uVar73) |
             !(bool)(bVar56 & 1) * auVar128._0_4_;
        bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar128._4_4_ =
             (uint)bVar15 * ((uint)bVar70 * auVar89._4_4_ | !bVar70 * uVar64) |
             !bVar15 * auVar128._4_4_;
        bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar128._8_4_ =
             (uint)bVar70 * ((uint)bVar9 * auVar89._8_4_ | !bVar9 * uVar58) |
             !bVar70 * auVar128._8_4_;
        bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar128._12_4_ =
             (uint)bVar70 * ((uint)bVar10 * auVar89._12_4_ | !bVar10 * uVar144) |
             !bVar70 * auVar128._12_4_;
        bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar128._16_4_ =
             (uint)bVar70 * ((uint)bVar11 * auVar89._16_4_ | !bVar11 * uVar145) |
             !bVar70 * auVar128._16_4_;
        bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar128._20_4_ =
             (uint)bVar70 * ((uint)bVar12 * auVar89._20_4_ | !bVar12 * uVar146) |
             !bVar70 * auVar128._20_4_;
        bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar128._24_4_ =
             (uint)bVar70 * ((uint)bVar13 * auVar89._24_4_ | !bVar13 * uVar147) |
             !bVar70 * auVar128._24_4_;
        bVar70 = SUB81(uVar72 >> 7,0);
        auVar128._28_4_ =
             (uint)bVar70 * ((uint)bVar14 * auVar89._28_4_ | !bVar14 * uVar148) |
             !bVar70 * auVar128._28_4_;
        bVar54 = (~bVar56 | bVar62) & bVar54;
      }
      if ((bVar54 & 0x7f) == 0) {
        auVar163 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        goto LAB_01e400bf;
      }
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar114 = vxorps_avx512vl(auVar114,auVar115);
      auVar112 = vxorps_avx512vl(auVar112,auVar115);
      uVar73 = *(uint *)(ray + k * 4 + 0x200);
      auVar113 = vxorps_avx512vl(auVar113,auVar115);
      auVar76 = vsubss_avx512f(ZEXT416(uVar73),ZEXT416((uint)local_970._0_4_));
      auVar89 = vbroadcastss_avx512vl(auVar76);
      auVar116 = vminps_avx512vl(auVar89,auVar128);
      auVar53._4_4_ = fStack_5bc;
      auVar53._0_4_ = local_5c0;
      auVar53._8_4_ = fStack_5b8;
      auVar53._12_4_ = fStack_5b4;
      auVar53._16_4_ = fStack_5b0;
      auVar53._20_4_ = fStack_5ac;
      auVar53._24_4_ = fStack_5a8;
      auVar53._28_4_ = fStack_5a4;
      auVar89 = vmaxps_avx512vl(auVar53,auVar127);
      auVar119 = vmulps_avx512vl(auVar119,auVar129);
      auVar118 = vfmadd213ps_avx512vl(auVar118,auVar255,auVar119);
      auVar76 = vfmadd213ps_fma(auVar117,auVar254,auVar118);
      in_ZMM31 = ZEXT3264(local_860);
      auVar117 = vmulps_avx512vl(local_860,auVar129);
      auVar117 = vfmadd231ps_avx512vl(auVar117,local_780,auVar255);
      auVar117 = vfmadd231ps_avx512vl(auVar117,_local_760,auVar254);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar117,auVar118);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar19 = vcmpps_avx512vl(auVar118,auVar119,1);
      auVar121 = vxorps_avx512vl(ZEXT1632(auVar76),auVar115);
      auVar129 = vrcp14ps_avx512vl(auVar117);
      auVar125 = vxorps_avx512vl(auVar117,auVar115);
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar130 = vfnmadd213ps_avx512vl(auVar129,auVar117,auVar126);
      auVar76 = vfmadd132ps_fma(auVar130,auVar129,auVar129);
      fVar165 = auVar76._0_4_ * auVar121._0_4_;
      fVar178 = auVar76._4_4_ * auVar121._4_4_;
      auVar39._4_4_ = fVar178;
      auVar39._0_4_ = fVar165;
      fVar179 = auVar76._8_4_ * auVar121._8_4_;
      auVar39._8_4_ = fVar179;
      fVar180 = auVar76._12_4_ * auVar121._12_4_;
      auVar39._12_4_ = fVar180;
      fVar182 = auVar121._16_4_ * 0.0;
      auVar39._16_4_ = fVar182;
      fVar181 = auVar121._20_4_ * 0.0;
      auVar39._20_4_ = fVar181;
      fVar183 = auVar121._24_4_ * 0.0;
      auVar39._24_4_ = fVar183;
      auVar39._28_4_ = auVar121._28_4_;
      uVar20 = vcmpps_avx512vl(auVar117,auVar125,1);
      bVar56 = (byte)uVar19 | (byte)uVar20;
      auVar251._8_4_ = 0xff800000;
      auVar251._0_8_ = 0xff800000ff800000;
      auVar251._12_4_ = 0xff800000;
      auVar251._16_4_ = 0xff800000;
      auVar251._20_4_ = 0xff800000;
      auVar251._24_4_ = 0xff800000;
      auVar251._28_4_ = 0xff800000;
      auVar130 = vblendmps_avx512vl(auVar39,auVar251);
      auVar131._0_4_ =
           (uint)(bVar56 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar129._0_4_;
      bVar70 = (bool)(bVar56 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar70 * auVar130._4_4_ | (uint)!bVar70 * auVar129._4_4_;
      bVar70 = (bool)(bVar56 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar70 * auVar130._8_4_ | (uint)!bVar70 * auVar129._8_4_;
      bVar70 = (bool)(bVar56 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar70 * auVar130._12_4_ | (uint)!bVar70 * auVar129._12_4_;
      bVar70 = (bool)(bVar56 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar70 * auVar130._16_4_ | (uint)!bVar70 * auVar129._16_4_;
      bVar70 = (bool)(bVar56 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar70 * auVar130._20_4_ | (uint)!bVar70 * auVar129._20_4_;
      bVar70 = (bool)(bVar56 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar70 * auVar130._24_4_ | (uint)!bVar70 * auVar129._24_4_;
      auVar131._28_4_ =
           (uint)(bVar56 >> 7) * auVar130._28_4_ | (uint)!(bool)(bVar56 >> 7) * auVar129._28_4_;
      auVar129 = vmaxps_avx512vl(auVar89,auVar131);
      uVar20 = vcmpps_avx512vl(auVar117,auVar125,6);
      bVar56 = (byte)uVar19 | (byte)uVar20;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar132._0_4_ =
           (uint)(bVar56 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar56 & 1) * (int)fVar165;
      bVar70 = (bool)(bVar56 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar70 * auVar117._4_4_ | (uint)!bVar70 * (int)fVar178;
      bVar70 = (bool)(bVar56 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar70 * auVar117._8_4_ | (uint)!bVar70 * (int)fVar179;
      bVar70 = (bool)(bVar56 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar70 * auVar117._12_4_ | (uint)!bVar70 * (int)fVar180;
      bVar70 = (bool)(bVar56 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar70 * auVar117._16_4_ | (uint)!bVar70 * (int)fVar182;
      bVar70 = (bool)(bVar56 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar70 * auVar117._20_4_ | (uint)!bVar70 * (int)fVar181;
      bVar70 = (bool)(bVar56 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar70 * auVar117._24_4_ | (uint)!bVar70 * (int)fVar183;
      auVar132._28_4_ =
           (uint)(bVar56 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar56 >> 7) * auVar121._28_4_;
      auVar121 = vminps_avx512vl(auVar116,auVar132);
      auVar89 = vsubps_avx(ZEXT832(0) << 0x20,auVar106);
      auVar106 = vsubps_avx(ZEXT832(0) << 0x20,auVar107);
      auVar125 = ZEXT832(0) << 0x20;
      auVar107 = vsubps_avx(auVar125,auVar108);
      auVar107 = vmulps_avx512vl(auVar107,auVar114);
      auVar106 = vfmadd231ps_avx512vl(auVar107,auVar113,auVar106);
      auVar89 = vfmadd231ps_avx512vl(auVar106,auVar112,auVar89);
      auVar106 = vmulps_avx512vl(local_860,auVar114);
      auVar106 = vfmadd231ps_avx512vl(auVar106,local_780,auVar113);
      auVar106 = vfmadd231ps_avx512vl(auVar106,_local_760,auVar112);
      vandps_avx512vl(auVar106,auVar118);
      uVar19 = vcmpps_avx512vl(auVar106,auVar119,1);
      auVar107 = vxorps_avx512vl(auVar89,auVar115);
      auVar89 = vrcp14ps_avx512vl(auVar106);
      auVar108 = vxorps_avx512vl(auVar106,auVar115);
      auVar112 = vfnmadd213ps_avx512vl(auVar89,auVar106,auVar126);
      auVar76 = vfmadd132ps_fma(auVar112,auVar89,auVar89);
      fVar165 = auVar76._0_4_ * auVar107._0_4_;
      fVar178 = auVar76._4_4_ * auVar107._4_4_;
      auVar40._4_4_ = fVar178;
      auVar40._0_4_ = fVar165;
      fVar179 = auVar76._8_4_ * auVar107._8_4_;
      auVar40._8_4_ = fVar179;
      fVar180 = auVar76._12_4_ * auVar107._12_4_;
      auVar40._12_4_ = fVar180;
      fVar182 = auVar107._16_4_ * 0.0;
      auVar40._16_4_ = fVar182;
      fVar181 = auVar107._20_4_ * 0.0;
      auVar40._20_4_ = fVar181;
      fVar183 = auVar107._24_4_ * 0.0;
      auVar40._24_4_ = fVar183;
      auVar40._28_4_ = auVar107._28_4_;
      uVar20 = vcmpps_avx512vl(auVar106,auVar108,1);
      bVar56 = (byte)uVar19 | (byte)uVar20;
      auVar112 = vblendmps_avx512vl(auVar40,auVar251);
      auVar133._0_4_ =
           (uint)(bVar56 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar89._0_4_;
      bVar70 = (bool)(bVar56 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar70 * auVar112._4_4_ | (uint)!bVar70 * auVar89._4_4_;
      bVar70 = (bool)(bVar56 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar70 * auVar112._8_4_ | (uint)!bVar70 * auVar89._8_4_;
      bVar70 = (bool)(bVar56 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar70 * auVar112._12_4_ | (uint)!bVar70 * auVar89._12_4_;
      bVar70 = (bool)(bVar56 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar70 * auVar112._16_4_ | (uint)!bVar70 * auVar89._16_4_;
      bVar70 = (bool)(bVar56 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar70 * auVar112._20_4_ | (uint)!bVar70 * auVar89._20_4_;
      bVar70 = (bool)(bVar56 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar70 * auVar112._24_4_ | (uint)!bVar70 * auVar89._24_4_;
      auVar133._28_4_ =
           (uint)(bVar56 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar56 >> 7) * auVar89._28_4_;
      auVar89 = vmaxps_avx(auVar129,auVar133);
      uVar20 = vcmpps_avx512vl(auVar106,auVar108,6);
      bVar56 = (byte)uVar19 | (byte)uVar20;
      auVar134._0_4_ =
           (uint)(bVar56 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar56 & 1) * (int)fVar165;
      bVar70 = (bool)(bVar56 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar70 * auVar117._4_4_ | (uint)!bVar70 * (int)fVar178;
      bVar70 = (bool)(bVar56 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar70 * auVar117._8_4_ | (uint)!bVar70 * (int)fVar179;
      bVar70 = (bool)(bVar56 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar70 * auVar117._12_4_ | (uint)!bVar70 * (int)fVar180;
      bVar70 = (bool)(bVar56 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar70 * auVar117._16_4_ | (uint)!bVar70 * (int)fVar182;
      bVar70 = (bool)(bVar56 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar70 * auVar117._20_4_ | (uint)!bVar70 * (int)fVar181;
      bVar70 = (bool)(bVar56 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar70 * auVar117._24_4_ | (uint)!bVar70 * (int)fVar183;
      auVar134._28_4_ =
           (uint)(bVar56 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar56 >> 7) * auVar107._28_4_;
      local_640 = vminps_avx(auVar121,auVar134);
      uVar19 = vcmpps_avx512vl(auVar89,local_640,2);
      bVar54 = bVar54 & 0x7f & (byte)uVar19;
      if (bVar54 == 0) {
        auVar163 = ZEXT3264(auVar126);
        goto LAB_01e400bf;
      }
      auVar88 = vmaxps_avx(auVar125,auVar88);
      auVar106 = vfmadd213ps_avx512vl(local_9a0,auVar122,auVar111);
      fVar165 = auVar109._0_4_;
      fVar178 = auVar109._4_4_;
      auVar41._4_4_ = fVar178 * auVar106._4_4_;
      auVar41._0_4_ = fVar165 * auVar106._0_4_;
      fVar179 = auVar109._8_4_;
      auVar41._8_4_ = fVar179 * auVar106._8_4_;
      fVar180 = auVar109._12_4_;
      auVar41._12_4_ = fVar180 * auVar106._12_4_;
      fVar182 = auVar109._16_4_;
      auVar41._16_4_ = fVar182 * auVar106._16_4_;
      fVar181 = auVar109._20_4_;
      auVar41._20_4_ = fVar181 * auVar106._20_4_;
      fVar183 = auVar109._24_4_;
      auVar41._24_4_ = fVar183 * auVar106._24_4_;
      auVar41._28_4_ = auVar106._28_4_;
      auVar106 = vfmadd213ps_avx512vl(local_9e0,auVar122,auVar111);
      auVar42._4_4_ = fVar178 * auVar106._4_4_;
      auVar42._0_4_ = fVar165 * auVar106._0_4_;
      auVar42._8_4_ = fVar179 * auVar106._8_4_;
      auVar42._12_4_ = fVar180 * auVar106._12_4_;
      auVar42._16_4_ = fVar182 * auVar106._16_4_;
      auVar42._20_4_ = fVar181 * auVar106._20_4_;
      auVar42._24_4_ = fVar183 * auVar106._24_4_;
      auVar42._28_4_ = auVar133._28_4_;
      auVar106 = vminps_avx512vl(auVar41,auVar126);
      auVar107 = ZEXT832(0) << 0x20;
      auVar106 = vmaxps_avx(auVar106,ZEXT832(0) << 0x20);
      auVar108 = vminps_avx512vl(auVar42,auVar126);
      auVar43._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
      auVar43._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
      auVar43._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
      auVar43._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
      auVar43._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
      auVar43._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
      auVar43._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
      auVar43._28_4_ = auVar106._28_4_ + 7.0;
      local_520 = vfmadd213ps_avx512vl(auVar43,auVar248,auVar223);
      auVar106 = vmaxps_avx(auVar108,ZEXT832(0) << 0x20);
      auVar44._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar106._28_4_ + 7.0;
      local_540 = vfmadd213ps_avx512vl(auVar44,auVar248,auVar223);
      auVar45._4_4_ = auVar88._4_4_ * auVar88._4_4_;
      auVar45._0_4_ = auVar88._0_4_ * auVar88._0_4_;
      auVar45._8_4_ = auVar88._8_4_ * auVar88._8_4_;
      auVar45._12_4_ = auVar88._12_4_ * auVar88._12_4_;
      auVar45._16_4_ = auVar88._16_4_ * auVar88._16_4_;
      auVar45._20_4_ = auVar88._20_4_ * auVar88._20_4_;
      auVar45._24_4_ = auVar88._24_4_ * auVar88._24_4_;
      auVar45._28_4_ = auVar88._28_4_;
      auVar106 = vsubps_avx(auVar123,auVar45);
      auVar46._4_4_ = auVar106._4_4_ * (float)local_7c0._4_4_;
      auVar46._0_4_ = auVar106._0_4_ * (float)local_7c0._0_4_;
      auVar46._8_4_ = auVar106._8_4_ * fStack_7b8;
      auVar46._12_4_ = auVar106._12_4_ * fStack_7b4;
      auVar46._16_4_ = auVar106._16_4_ * fStack_7b0;
      auVar46._20_4_ = auVar106._20_4_ * fStack_7ac;
      auVar46._24_4_ = auVar106._24_4_ * fStack_7a8;
      auVar46._28_4_ = auVar88._28_4_;
      auVar88 = vsubps_avx(local_7a0,auVar46);
      uVar19 = vcmpps_avx512vl(auVar88,ZEXT832(0) << 0x20,5);
      bVar56 = (byte)uVar19;
      if (bVar56 == 0) {
        bVar56 = 0;
        auVar102 = ZEXT832(0) << 0x20;
        auVar163 = ZEXT864(0) << 0x20;
        auVar88 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar108 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar253 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar135._8_4_ = 0x7f800000;
        auVar135._0_8_ = 0x7f8000007f800000;
        auVar135._12_4_ = 0x7f800000;
        auVar135._16_4_ = 0x7f800000;
        auVar135._20_4_ = 0x7f800000;
        auVar135._24_4_ = 0x7f800000;
        auVar135._28_4_ = 0x7f800000;
        auVar136._8_4_ = 0xff800000;
        auVar136._0_8_ = 0xff800000ff800000;
        auVar136._12_4_ = 0xff800000;
        auVar136._16_4_ = 0xff800000;
        auVar136._20_4_ = 0xff800000;
        auVar136._24_4_ = 0xff800000;
        auVar136._28_4_ = 0xff800000;
      }
      else {
        auVar77 = vxorps_avx512vl(auVar116._0_16_,auVar116._0_16_);
        uVar72 = vcmpps_avx512vl(auVar88,auVar125,5);
        auVar88 = vsqrtps_avx(auVar88);
        auVar107 = vfnmadd213ps_avx512vl(auVar124,local_840,auVar126);
        auVar112 = vfmadd132ps_avx512vl(auVar107,local_840,local_840);
        auVar107 = vsubps_avx(local_7e0,auVar88);
        auVar113 = vmulps_avx512vl(auVar107,auVar112);
        auVar88 = vsubps_avx512vl(auVar88,auVar120);
        auVar112 = vmulps_avx512vl(auVar88,auVar112);
        auVar88 = vfmadd213ps_avx512vl(auVar122,auVar113,auVar111);
        auVar47._4_4_ = fVar178 * auVar88._4_4_;
        auVar47._0_4_ = fVar165 * auVar88._0_4_;
        auVar47._8_4_ = fVar179 * auVar88._8_4_;
        auVar47._12_4_ = fVar180 * auVar88._12_4_;
        auVar47._16_4_ = fVar182 * auVar88._16_4_;
        auVar47._20_4_ = fVar181 * auVar88._20_4_;
        auVar47._24_4_ = fVar183 * auVar88._24_4_;
        auVar47._28_4_ = auVar108._28_4_;
        auVar48._4_4_ = (float)local_760._4_4_ * auVar113._4_4_;
        auVar48._0_4_ = (float)local_760._0_4_ * auVar113._0_4_;
        auVar48._8_4_ = fStack_758 * auVar113._8_4_;
        auVar48._12_4_ = fStack_754 * auVar113._12_4_;
        auVar48._16_4_ = fStack_750 * auVar113._16_4_;
        auVar48._20_4_ = fStack_74c * auVar113._20_4_;
        auVar48._24_4_ = fStack_748 * auVar113._24_4_;
        auVar48._28_4_ = auVar88._28_4_;
        auVar107 = vmulps_avx512vl(local_780,auVar113);
        auVar114 = vmulps_avx512vl(local_860,auVar113);
        auVar88 = vfmadd213ps_avx512vl(auVar102,auVar47,auVar228);
        auVar88 = vsubps_avx512vl(auVar48,auVar88);
        auVar108 = vfmadd213ps_avx512vl(auVar103,auVar47,auVar105);
        auVar108 = vsubps_avx512vl(auVar107,auVar108);
        auVar76 = vfmadd213ps_fma(auVar47,auVar104,auVar110);
        auVar107 = vsubps_avx(auVar114,ZEXT1632(auVar76));
        auVar253 = auVar107._0_28_;
        auVar107 = vfmadd213ps_avx512vl(auVar122,auVar112,auVar111);
        auVar109 = vmulps_avx512vl(auVar109,auVar107);
        auVar256 = ZEXT3264(auVar109);
        auVar49._4_4_ = (float)local_760._4_4_ * auVar112._4_4_;
        auVar49._0_4_ = (float)local_760._0_4_ * auVar112._0_4_;
        auVar49._8_4_ = fStack_758 * auVar112._8_4_;
        auVar49._12_4_ = fStack_754 * auVar112._12_4_;
        auVar49._16_4_ = fStack_750 * auVar112._16_4_;
        auVar49._20_4_ = fStack_74c * auVar112._20_4_;
        auVar49._24_4_ = fStack_748 * auVar112._24_4_;
        auVar49._28_4_ = auVar114._28_4_;
        auVar111 = vmulps_avx512vl(local_780,auVar112);
        auVar114 = vmulps_avx512vl(local_860,auVar112);
        auVar76 = vfmadd213ps_fma(auVar102,auVar109,auVar228);
        auVar107 = vsubps_avx(auVar49,ZEXT1632(auVar76));
        auVar76 = vfmadd213ps_fma(auVar103,auVar109,auVar105);
        auVar102 = vsubps_avx512vl(auVar111,ZEXT1632(auVar76));
        auVar76 = vfmadd213ps_fma(auVar104,auVar109,auVar110);
        auVar103 = vsubps_avx512vl(auVar114,ZEXT1632(auVar76));
        auVar163 = ZEXT3264(auVar103);
        auVar207._8_4_ = 0x7f800000;
        auVar207._0_8_ = 0x7f8000007f800000;
        auVar207._12_4_ = 0x7f800000;
        auVar207._16_4_ = 0x7f800000;
        auVar207._20_4_ = 0x7f800000;
        auVar207._24_4_ = 0x7f800000;
        auVar207._28_4_ = 0x7f800000;
        auVar103 = vblendmps_avx512vl(auVar207,auVar113);
        bVar70 = (bool)((byte)uVar72 & 1);
        auVar135._0_4_ = (uint)bVar70 * auVar103._0_4_ | (uint)!bVar70 * 0x7f800000;
        bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar70 * auVar103._4_4_ | (uint)!bVar70 * 0x7f800000;
        bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar70 * auVar103._8_4_ | (uint)!bVar70 * 0x7f800000;
        bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar70 * auVar103._12_4_ | (uint)!bVar70 * 0x7f800000;
        bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar135._16_4_ = (uint)bVar70 * auVar103._16_4_ | (uint)!bVar70 * 0x7f800000;
        bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar135._20_4_ = (uint)bVar70 * auVar103._20_4_ | (uint)!bVar70 * 0x7f800000;
        bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar135._24_4_ = (uint)bVar70 * auVar103._24_4_ | (uint)!bVar70 * 0x7f800000;
        bVar70 = SUB81(uVar72 >> 7,0);
        auVar135._28_4_ = (uint)bVar70 * auVar103._28_4_ | (uint)!bVar70 * 0x7f800000;
        auVar229._8_4_ = 0xff800000;
        auVar229._0_8_ = 0xff800000ff800000;
        auVar229._12_4_ = 0xff800000;
        auVar229._16_4_ = 0xff800000;
        auVar229._20_4_ = 0xff800000;
        auVar229._24_4_ = 0xff800000;
        auVar229._28_4_ = 0xff800000;
        auVar103 = vblendmps_avx512vl(auVar229,auVar112);
        bVar70 = (bool)((byte)uVar72 & 1);
        auVar136._0_4_ = (uint)bVar70 * auVar103._0_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar70 * auVar103._4_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar70 * auVar103._8_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar70 * auVar103._12_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar136._16_4_ = (uint)bVar70 * auVar103._16_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar136._20_4_ = (uint)bVar70 * auVar103._20_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar136._24_4_ = (uint)bVar70 * auVar103._24_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = SUB81(uVar72 >> 7,0);
        auVar136._28_4_ = (uint)bVar70 * auVar103._28_4_ | (uint)!bVar70 * -0x800000;
        auVar34._8_4_ = 0x36000000;
        auVar34._0_8_ = 0x3600000036000000;
        auVar34._12_4_ = 0x36000000;
        auVar34._16_4_ = 0x36000000;
        auVar34._20_4_ = 0x36000000;
        auVar34._24_4_ = 0x36000000;
        auVar34._28_4_ = 0x36000000;
        auVar103 = vmulps_avx512vl(local_800,auVar34);
        uVar59 = vcmpps_avx512vl(auVar103,local_820,0xe);
        uVar72 = uVar72 & uVar59;
        bVar62 = (byte)uVar72;
        if (bVar62 != 0) {
          uVar59 = vcmpps_avx512vl(auVar106,ZEXT1632(auVar77),2);
          auVar249._8_4_ = 0x7f800000;
          auVar249._0_8_ = 0x7f8000007f800000;
          auVar249._12_4_ = 0x7f800000;
          auVar249._16_4_ = 0x7f800000;
          auVar249._20_4_ = 0x7f800000;
          auVar249._24_4_ = 0x7f800000;
          auVar249._28_4_ = 0x7f800000;
          auVar252._8_4_ = 0xff800000;
          auVar252._0_8_ = 0xff800000ff800000;
          auVar252._12_4_ = 0xff800000;
          auVar252._16_4_ = 0xff800000;
          auVar252._20_4_ = 0xff800000;
          auVar252._24_4_ = 0xff800000;
          auVar252._28_4_ = 0xff800000;
          auVar104 = vblendmps_avx512vl(auVar249,auVar252);
          bVar66 = (byte)uVar59;
          uVar64 = (uint)(bVar66 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar103._0_4_;
          bVar70 = (bool)((byte)(uVar59 >> 1) & 1);
          uVar58 = (uint)bVar70 * auVar104._4_4_ | (uint)!bVar70 * auVar103._4_4_;
          bVar70 = (bool)((byte)(uVar59 >> 2) & 1);
          uVar144 = (uint)bVar70 * auVar104._8_4_ | (uint)!bVar70 * auVar103._8_4_;
          bVar70 = (bool)((byte)(uVar59 >> 3) & 1);
          uVar145 = (uint)bVar70 * auVar104._12_4_ | (uint)!bVar70 * auVar103._12_4_;
          bVar70 = (bool)((byte)(uVar59 >> 4) & 1);
          uVar146 = (uint)bVar70 * auVar104._16_4_ | (uint)!bVar70 * auVar103._16_4_;
          bVar70 = (bool)((byte)(uVar59 >> 5) & 1);
          uVar147 = (uint)bVar70 * auVar104._20_4_ | (uint)!bVar70 * auVar103._20_4_;
          bVar70 = (bool)((byte)(uVar59 >> 6) & 1);
          uVar148 = (uint)bVar70 * auVar104._24_4_ | (uint)!bVar70 * auVar103._24_4_;
          bVar70 = SUB81(uVar59 >> 7,0);
          uVar149 = (uint)bVar70 * auVar104._28_4_ | (uint)!bVar70 * auVar103._28_4_;
          auVar135._0_4_ = (bVar62 & 1) * uVar64 | !(bool)(bVar62 & 1) * auVar135._0_4_;
          bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar135._4_4_ = bVar70 * uVar58 | !bVar70 * auVar135._4_4_;
          bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar135._8_4_ = bVar70 * uVar144 | !bVar70 * auVar135._8_4_;
          bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar135._12_4_ = bVar70 * uVar145 | !bVar70 * auVar135._12_4_;
          bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar135._16_4_ = bVar70 * uVar146 | !bVar70 * auVar135._16_4_;
          bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar135._20_4_ = bVar70 * uVar147 | !bVar70 * auVar135._20_4_;
          bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar135._24_4_ = bVar70 * uVar148 | !bVar70 * auVar135._24_4_;
          bVar70 = SUB81(uVar72 >> 7,0);
          auVar135._28_4_ = bVar70 * uVar149 | !bVar70 * auVar135._28_4_;
          auVar103 = vblendmps_avx512vl(auVar252,auVar249);
          bVar70 = (bool)((byte)(uVar59 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar59 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar59 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar59 >> 6) & 1);
          bVar14 = SUB81(uVar59 >> 7,0);
          auVar136._0_4_ =
               (uint)(bVar62 & 1) *
               ((uint)(bVar66 & 1) * auVar103._0_4_ | !(bool)(bVar66 & 1) * uVar64) |
               !(bool)(bVar62 & 1) * auVar136._0_4_;
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar136._4_4_ =
               (uint)bVar15 * ((uint)bVar70 * auVar103._4_4_ | !bVar70 * uVar58) |
               !bVar15 * auVar136._4_4_;
          bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar136._8_4_ =
               (uint)bVar70 * ((uint)bVar9 * auVar103._8_4_ | !bVar9 * uVar144) |
               !bVar70 * auVar136._8_4_;
          bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar136._12_4_ =
               (uint)bVar70 * ((uint)bVar10 * auVar103._12_4_ | !bVar10 * uVar145) |
               !bVar70 * auVar136._12_4_;
          bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar136._16_4_ =
               (uint)bVar70 * ((uint)bVar11 * auVar103._16_4_ | !bVar11 * uVar146) |
               !bVar70 * auVar136._16_4_;
          bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar136._20_4_ =
               (uint)bVar70 * ((uint)bVar12 * auVar103._20_4_ | !bVar12 * uVar147) |
               !bVar70 * auVar136._20_4_;
          bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar136._24_4_ =
               (uint)bVar70 * ((uint)bVar13 * auVar103._24_4_ | !bVar13 * uVar148) |
               !bVar70 * auVar136._24_4_;
          bVar70 = SUB81(uVar72 >> 7,0);
          auVar136._28_4_ =
               (uint)bVar70 * ((uint)bVar14 * auVar103._28_4_ | !bVar14 * uVar149) |
               !bVar70 * auVar136._28_4_;
          bVar56 = (~bVar62 | bVar66) & bVar56;
        }
      }
      auVar230._0_4_ = local_860._0_4_ * auVar163._0_4_;
      auVar230._4_4_ = local_860._4_4_ * auVar163._4_4_;
      auVar230._8_4_ = local_860._8_4_ * auVar163._8_4_;
      auVar230._12_4_ = local_860._12_4_ * auVar163._12_4_;
      auVar230._16_4_ = local_860._16_4_ * auVar163._16_4_;
      auVar230._20_4_ = local_860._20_4_ * auVar163._20_4_;
      auVar230._28_36_ = auVar163._28_36_;
      auVar230._24_4_ = local_860._24_4_ * auVar163._24_4_;
      auVar76 = vfmadd231ps_fma(auVar230._0_32_,local_780,auVar102);
      auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),_local_760,auVar107);
      auVar245._8_4_ = 0x7fffffff;
      auVar245._0_8_ = 0x7fffffff7fffffff;
      auVar245._12_4_ = 0x7fffffff;
      auVar245._16_4_ = 0x7fffffff;
      auVar245._20_4_ = 0x7fffffff;
      auVar245._24_4_ = 0x7fffffff;
      auVar245._28_4_ = 0x7fffffff;
      auVar102 = vandps_avx(ZEXT1632(auVar76),auVar245);
      _local_440 = auVar89;
      auVar239._8_4_ = 0x3e99999a;
      auVar239._0_8_ = 0x3e99999a3e99999a;
      auVar239._12_4_ = 0x3e99999a;
      auVar239._16_4_ = 0x3e99999a;
      auVar239._20_4_ = 0x3e99999a;
      auVar239._24_4_ = 0x3e99999a;
      auVar239._28_4_ = 0x3e99999a;
      uVar19 = vcmpps_avx512vl(auVar102,auVar239,1);
      local_6c0._0_2_ = (short)uVar19;
      local_660 = vmaxps_avx(auVar89,auVar136);
      auVar102 = vminps_avx(local_640,auVar135);
      uVar19 = vcmpps_avx512vl(auVar89,auVar102,2);
      bVar62 = (byte)uVar19 & bVar54;
      uVar20 = vcmpps_avx512vl(local_660,local_640,2);
      if ((bVar54 & ((byte)uVar20 | (byte)uVar19)) == 0) {
        auVar163 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar230 = ZEXT3264(local_900);
      }
      else {
        auVar50._4_4_ = local_860._4_4_ * auVar253._4_4_;
        auVar50._0_4_ = local_860._0_4_ * auVar253._0_4_;
        auVar50._8_4_ = local_860._8_4_ * auVar253._8_4_;
        auVar50._12_4_ = local_860._12_4_ * auVar253._12_4_;
        auVar50._16_4_ = local_860._16_4_ * auVar253._16_4_;
        auVar50._20_4_ = local_860._20_4_ * auVar253._20_4_;
        auVar50._24_4_ = local_860._24_4_ * auVar253._24_4_;
        auVar50._28_4_ = auVar102._28_4_;
        auVar76 = vfmadd213ps_fma(auVar108,local_780,auVar50);
        auVar76 = vfmadd213ps_fma(auVar88,_local_760,ZEXT1632(auVar76));
        auVar88 = vandps_avx(ZEXT1632(auVar76),auVar245);
        uVar19 = vcmpps_avx512vl(auVar88,auVar239,1);
        bVar66 = (byte)uVar19 | ~bVar56;
        auVar159._8_4_ = 2;
        auVar159._0_8_ = 0x200000002;
        auVar159._12_4_ = 2;
        auVar159._16_4_ = 2;
        auVar159._20_4_ = 2;
        auVar159._24_4_ = 2;
        auVar159._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar88 = vpblendmd_avx512vl(auVar159,auVar35);
        local_600._0_4_ = (uint)(bVar66 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar66 & 1) * 2;
        bVar70 = (bool)(bVar66 >> 1 & 1);
        local_600._4_4_ = (uint)bVar70 * auVar88._4_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar66 >> 2 & 1);
        local_600._8_4_ = (uint)bVar70 * auVar88._8_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar66 >> 3 & 1);
        local_600._12_4_ = (uint)bVar70 * auVar88._12_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar66 >> 4 & 1);
        local_600._16_4_ = (uint)bVar70 * auVar88._16_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar66 >> 5 & 1);
        local_600._20_4_ = (uint)bVar70 * auVar88._20_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar66 >> 6 & 1);
        local_600._24_4_ = (uint)bVar70 * auVar88._24_4_ | (uint)!bVar70 * 2;
        local_600._28_4_ = (uint)(bVar66 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar66 >> 7) * 2;
        local_680 = vpbroadcastd_avx512vl();
        uVar19 = vpcmpd_avx512vl(local_680,local_600,5);
        bVar66 = (byte)uVar19 & bVar62;
        auVar163 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        if (bVar66 == 0) {
          auVar161._4_4_ = uVar73;
          auVar161._0_4_ = uVar73;
          auVar161._8_4_ = uVar73;
          auVar161._12_4_ = uVar73;
          auVar161._16_4_ = uVar73;
          auVar161._20_4_ = uVar73;
          auVar161._24_4_ = uVar73;
          auVar161._28_4_ = uVar73;
          auVar88 = local_660;
        }
        else {
          local_620 = local_660;
          auVar77 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar76 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar78 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar83 = vminps_avx(auVar77,auVar78);
          auVar77 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar78 = vmaxps_avx(auVar76,auVar77);
          auVar185._8_4_ = 0x7fffffff;
          auVar185._0_8_ = 0x7fffffff7fffffff;
          auVar185._12_4_ = 0x7fffffff;
          auVar76 = vandps_avx(auVar83,auVar185);
          auVar77 = vandps_avx(auVar78,auVar185);
          auVar76 = vmaxps_avx(auVar76,auVar77);
          auVar77 = vmovshdup_avx(auVar76);
          auVar77 = vmaxss_avx(auVar77,auVar76);
          auVar76 = vshufpd_avx(auVar76,auVar76,1);
          auVar76 = vmaxss_avx(auVar76,auVar77);
          fVar165 = auVar76._0_4_ * 1.9073486e-06;
          local_960 = vshufps_avx(auVar78,auVar78,0xff);
          local_c80 = auVar89._0_4_;
          fStack_c7c = auVar89._4_4_;
          fStack_c78 = auVar89._8_4_;
          fStack_c74 = auVar89._12_4_;
          fStack_c70 = auVar89._16_4_;
          fStack_c6c = auVar89._20_4_;
          fStack_c68 = auVar89._24_4_;
          fStack_c64 = auVar89._28_4_;
          local_6a0 = local_c80 + fVar150;
          fStack_69c = fStack_c7c + fVar150;
          fStack_698 = fStack_c78 + fVar150;
          fStack_694 = fStack_c74 + fVar150;
          fStack_690 = fStack_c70 + fVar150;
          fStack_68c = fStack_c6c + fVar150;
          fStack_688 = fStack_c68 + fVar150;
          fStack_684 = fStack_c64 + fVar150;
          do {
            auVar160._8_4_ = 0x7f800000;
            auVar160._0_8_ = 0x7f8000007f800000;
            auVar160._12_4_ = 0x7f800000;
            auVar160._16_4_ = 0x7f800000;
            auVar160._20_4_ = 0x7f800000;
            auVar160._24_4_ = 0x7f800000;
            auVar160._28_4_ = 0x7f800000;
            auVar88 = vblendmps_avx512vl(auVar160,auVar89);
            auVar138._0_4_ =
                 (uint)(bVar66 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar66 & 1) * 0x7f800000;
            bVar70 = (bool)(bVar66 >> 1 & 1);
            auVar138._4_4_ = (uint)bVar70 * auVar88._4_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar66 >> 2 & 1);
            auVar138._8_4_ = (uint)bVar70 * auVar88._8_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar66 >> 3 & 1);
            auVar138._12_4_ = (uint)bVar70 * auVar88._12_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar66 >> 4 & 1);
            auVar138._16_4_ = (uint)bVar70 * auVar88._16_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar66 >> 5 & 1);
            auVar138._20_4_ = (uint)bVar70 * auVar88._20_4_ | (uint)!bVar70 * 0x7f800000;
            auVar138._24_4_ =
                 (uint)(bVar66 >> 6) * auVar88._24_4_ | (uint)!(bool)(bVar66 >> 6) * 0x7f800000;
            auVar138._28_4_ = 0x7f800000;
            auVar88 = vshufps_avx(auVar138,auVar138,0xb1);
            auVar88 = vminps_avx(auVar138,auVar88);
            auVar102 = vshufpd_avx(auVar88,auVar88,5);
            auVar88 = vminps_avx(auVar88,auVar102);
            auVar102 = vpermpd_avx2(auVar88,0x4e);
            auVar88 = vminps_avx(auVar88,auVar102);
            uVar19 = vcmpps_avx512vl(auVar138,auVar88,0);
            bVar55 = (byte)uVar19 & bVar66;
            bVar57 = bVar66;
            if (bVar55 != 0) {
              bVar57 = bVar55;
            }
            iVar22 = 0;
            for (uVar73 = (uint)bVar57; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            uVar73 = *(uint *)(local_520 + (uint)(iVar22 << 2));
            uVar64 = *(uint *)(local_440 + (uint)(iVar22 << 2));
            fVar178 = auVar16._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar178 = sqrtf((float)local_9c0._0_4_);
            }
            auVar76 = vinsertps_avx(ZEXT416(uVar64),ZEXT416(uVar73),0x10);
            auVar230 = ZEXT1664(auVar76);
            bVar70 = true;
            uVar72 = 0;
            do {
              uVar166 = auVar230._0_4_;
              auVar151._4_4_ = uVar166;
              auVar151._0_4_ = uVar166;
              auVar151._8_4_ = uVar166;
              auVar151._12_4_ = uVar166;
              auVar77 = vfmadd132ps_fma(auVar151,ZEXT816(0) << 0x40,local_9b0);
              auVar78 = auVar230._0_16_;
              auVar76 = vmovshdup_avx(auVar78);
              local_7e0._0_16_ = auVar76;
              fVar183 = 1.0 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar78,auVar78,0x55);
              fVar179 = auVar76._0_4_;
              auVar186._0_4_ = local_8c0._0_4_ * fVar179;
              fVar180 = auVar76._4_4_;
              auVar186._4_4_ = local_8c0._4_4_ * fVar180;
              fVar182 = auVar76._8_4_;
              auVar186._8_4_ = local_8c0._8_4_ * fVar182;
              fVar181 = auVar76._12_4_;
              auVar186._12_4_ = local_8c0._12_4_ * fVar181;
              _local_7c0 = ZEXT416((uint)fVar183);
              auVar213._4_4_ = fVar183;
              auVar213._0_4_ = fVar183;
              auVar213._8_4_ = fVar183;
              auVar213._12_4_ = fVar183;
              auVar76 = vfmadd231ps_fma(auVar186,auVar213,local_880._0_16_);
              auVar224._0_4_ = local_8a0._0_4_ * fVar179;
              auVar224._4_4_ = local_8a0._4_4_ * fVar180;
              auVar224._8_4_ = local_8a0._8_4_ * fVar182;
              auVar224._12_4_ = local_8a0._12_4_ * fVar181;
              auVar78 = vfmadd231ps_fma(auVar224,auVar213,local_8c0._0_16_);
              auVar233._0_4_ = fVar179 * (float)local_8e0._0_4_;
              auVar233._4_4_ = fVar180 * (float)local_8e0._4_4_;
              auVar233._8_4_ = fVar182 * fStack_8d8;
              auVar233._12_4_ = fVar181 * fStack_8d4;
              auVar83 = vfmadd231ps_fma(auVar233,auVar213,local_8a0._0_16_);
              auVar242._0_4_ = fVar179 * auVar78._0_4_;
              auVar242._4_4_ = fVar180 * auVar78._4_4_;
              auVar242._8_4_ = fVar182 * auVar78._8_4_;
              auVar242._12_4_ = fVar181 * auVar78._12_4_;
              auVar76 = vfmadd231ps_fma(auVar242,auVar213,auVar76);
              auVar187._0_4_ = fVar179 * auVar83._0_4_;
              auVar187._4_4_ = fVar180 * auVar83._4_4_;
              auVar187._8_4_ = fVar182 * auVar83._8_4_;
              auVar187._12_4_ = fVar181 * auVar83._12_4_;
              auVar78 = vfmadd231ps_fma(auVar187,auVar213,auVar78);
              auVar225._0_4_ = fVar179 * auVar78._0_4_;
              auVar225._4_4_ = fVar180 * auVar78._4_4_;
              auVar225._8_4_ = fVar182 * auVar78._8_4_;
              auVar225._12_4_ = fVar181 * auVar78._12_4_;
              auVar83 = vfmadd231ps_fma(auVar225,auVar76,auVar213);
              auVar76 = vsubps_avx(auVar78,auVar76);
              auVar23._8_4_ = 0x40400000;
              auVar23._0_8_ = 0x4040000040400000;
              auVar23._12_4_ = 0x40400000;
              auVar78 = vmulps_avx512vl(auVar76,auVar23);
              local_7a0._0_16_ = auVar83;
              auVar77 = vsubps_avx(auVar77,auVar83);
              auVar76 = vdpps_avx(auVar77,auVar77,0x7f);
              fVar179 = auVar76._0_4_;
              local_740 = auVar230;
              if (fVar179 < 0.0) {
                auVar163._0_4_ = sqrtf(fVar179);
                auVar163._4_60_ = extraout_var;
                auVar83 = auVar163._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar76,auVar76);
              }
              local_800._0_16_ = vdpps_avx(auVar78,auVar78,0x7f);
              fVar180 = local_800._0_4_;
              auVar188._4_12_ = ZEXT812(0) << 0x20;
              auVar188._0_4_ = fVar180;
              local_9e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
              fVar182 = local_9e0._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar75 = vxorps_avx512vl(local_800._0_16_,auVar24);
              auVar79 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar79._0_4_;
              local_9a0._0_4_ = auVar83._0_4_;
              if (fVar180 < auVar75._0_4_) {
                fVar181 = sqrtf(fVar180);
                auVar83 = ZEXT416((uint)local_9a0._0_4_);
              }
              else {
                auVar79 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar181 = auVar79._0_4_;
              }
              fVar183 = local_9e0._0_4_;
              fVar180 = fVar182 * 1.5 + fVar180 * -0.5 * fVar183 * fVar183 * fVar183;
              auVar152._0_4_ = auVar78._0_4_ * fVar180;
              auVar152._4_4_ = auVar78._4_4_ * fVar180;
              auVar152._8_4_ = auVar78._8_4_ * fVar180;
              auVar152._12_4_ = auVar78._12_4_ * fVar180;
              local_9e0._0_16_ = vdpps_avx(auVar77,auVar152,0x7f);
              auVar75 = vaddss_avx512f(auVar83,ZEXT416(0x3f800000));
              auVar153._0_4_ = local_9e0._0_4_ * local_9e0._0_4_;
              auVar153._4_4_ = local_9e0._4_4_ * local_9e0._4_4_;
              auVar153._8_4_ = local_9e0._8_4_ * local_9e0._8_4_;
              auVar153._12_4_ = local_9e0._12_4_ * local_9e0._12_4_;
              auVar76 = vsubps_avx(auVar76,auVar153);
              fVar182 = auVar76._0_4_;
              auVar168._4_12_ = ZEXT812(0) << 0x20;
              auVar168._0_4_ = fVar182;
              auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar168);
              auVar80 = vmulss_avx512f(auVar79,ZEXT416(0x3fc00000));
              auVar81 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
              uVar71 = fVar182 == 0.0;
              uVar69 = fVar182 < 0.0;
              if ((bool)uVar69) {
                local_920._0_4_ = fVar181;
                local_940._0_4_ = auVar80._0_4_;
                local_950._4_4_ = fVar180;
                local_950._0_4_ = fVar180;
                fStack_948 = fVar180;
                fStack_944 = fVar180;
                local_930 = auVar79;
                fVar182 = sqrtf(fVar182);
                auVar81 = ZEXT416(auVar81._0_4_);
                auVar80 = ZEXT416((uint)local_940._0_4_);
                auVar83 = ZEXT416((uint)local_9a0._0_4_);
                auVar75 = ZEXT416(auVar75._0_4_);
                auVar79 = local_930;
                fVar180 = (float)local_950._0_4_;
                fVar183 = (float)local_950._4_4_;
                fVar211 = fStack_948;
                fVar257 = fStack_944;
                fVar181 = (float)local_920._0_4_;
              }
              else {
                auVar76 = vsqrtss_avx(auVar76,auVar76);
                fVar182 = auVar76._0_4_;
                fVar183 = fVar180;
                fVar211 = fVar180;
                fVar257 = fVar180;
              }
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_);
              auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar184 = auVar76._0_4_ * 6.0;
              fVar17 = local_7e0._0_4_ * 6.0;
              auVar214._0_4_ = fVar17 * (float)local_8e0._0_4_;
              auVar214._4_4_ = fVar17 * (float)local_8e0._4_4_;
              auVar214._8_4_ = fVar17 * fStack_8d8;
              auVar214._12_4_ = fVar17 * fStack_8d4;
              auVar189._4_4_ = fVar184;
              auVar189._0_4_ = fVar184;
              auVar189._8_4_ = fVar184;
              auVar189._12_4_ = fVar184;
              auVar76 = vfmadd132ps_fma(auVar189,auVar214,local_8a0._0_16_);
              fVar184 = auVar84._0_4_ * 6.0;
              auVar169._4_4_ = fVar184;
              auVar169._0_4_ = fVar184;
              auVar169._8_4_ = fVar184;
              auVar169._12_4_ = fVar184;
              auVar76 = vfmadd132ps_fma(auVar169,auVar76,local_8c0._0_16_);
              fVar184 = local_7c0._0_4_ * 6.0;
              auVar190._4_4_ = fVar184;
              auVar190._0_4_ = fVar184;
              auVar190._8_4_ = fVar184;
              auVar190._12_4_ = fVar184;
              auVar76 = vfmadd132ps_fma(auVar190,auVar76,local_880._0_16_);
              auVar170._0_4_ = auVar76._0_4_ * (float)local_800._0_4_;
              auVar170._4_4_ = auVar76._4_4_ * (float)local_800._0_4_;
              auVar170._8_4_ = auVar76._8_4_ * (float)local_800._0_4_;
              auVar170._12_4_ = auVar76._12_4_ * (float)local_800._0_4_;
              auVar76 = vdpps_avx(auVar78,auVar76,0x7f);
              fVar184 = auVar76._0_4_;
              auVar191._0_4_ = auVar78._0_4_ * fVar184;
              auVar191._4_4_ = auVar78._4_4_ * fVar184;
              auVar191._8_4_ = auVar78._8_4_ * fVar184;
              auVar191._12_4_ = auVar78._12_4_ * fVar184;
              auVar76 = vsubps_avx(auVar170,auVar191);
              fVar184 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar84 = vmaxss_avx(ZEXT416((uint)fVar165),
                                   ZEXT416((uint)(local_740._0_4_ * fVar178 * 1.9073486e-06)));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar82 = vxorps_avx512vl(auVar78,auVar25);
              auVar192._0_4_ = fVar180 * auVar76._0_4_ * fVar184;
              auVar192._4_4_ = fVar183 * auVar76._4_4_ * fVar184;
              auVar192._8_4_ = fVar211 * auVar76._8_4_ * fVar184;
              auVar192._12_4_ = fVar257 * auVar76._12_4_ * fVar184;
              auVar256 = ZEXT1664(auVar152);
              auVar76 = vdpps_avx(auVar82,auVar152,0x7f);
              auVar85 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar165),auVar84);
              auVar83 = vdpps_avx(auVar77,auVar192,0x7f);
              vfmadd213ss_avx512f(auVar75,ZEXT416((uint)(fVar165 / fVar181)),auVar85);
              fVar180 = auVar76._0_4_ + auVar83._0_4_;
              auVar76 = vdpps_avx(local_9b0,auVar152,0x7f);
              auVar83 = vdpps_avx(auVar77,auVar82,0x7f);
              auVar75 = vmulss_avx512f(auVar81,auVar79);
              auVar79 = vmulss_avx512f(auVar79,auVar79);
              auVar80 = vaddss_avx512f(auVar80,ZEXT416((uint)(auVar75._0_4_ * auVar79._0_4_)));
              auVar79 = vdpps_avx(auVar77,local_9b0,0x7f);
              auVar81 = vfnmadd231ss_avx512f(auVar83,local_9e0._0_16_,ZEXT416((uint)fVar180));
              auVar79 = vfnmadd231ss_avx512f(auVar79,local_9e0._0_16_,auVar76);
              auVar83 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar182 = fVar182 - auVar83._0_4_;
              auVar75 = vshufps_avx(auVar78,auVar78,0xff);
              auVar83 = vfmsub213ss_fma(auVar81,auVar80,auVar75);
              auVar246._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
              auVar246._8_4_ = auVar83._8_4_ ^ 0x80000000;
              auVar246._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar79 = ZEXT416((uint)(auVar79._0_4_ * auVar80._0_4_));
              auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar83._0_4_)),
                                        ZEXT416((uint)fVar180),auVar79);
              auVar83 = vinsertps_avx(auVar246,auVar79,0x1c);
              auVar234._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
              auVar234._8_4_ = auVar76._8_4_ ^ 0x80000000;
              auVar234._12_4_ = auVar76._12_4_ ^ 0x80000000;
              auVar79 = vinsertps_avx(ZEXT416((uint)fVar180),auVar234,0x10);
              auVar215._0_4_ = auVar80._0_4_;
              auVar215._4_4_ = auVar215._0_4_;
              auVar215._8_4_ = auVar215._0_4_;
              auVar215._12_4_ = auVar215._0_4_;
              auVar76 = vdivps_avx(auVar83,auVar215);
              auVar83 = vdivps_avx(auVar79,auVar215);
              auVar79 = vbroadcastss_avx512vl(local_9e0._0_16_);
              auVar216._0_4_ = auVar79._0_4_ * auVar76._0_4_ + fVar182 * auVar83._0_4_;
              auVar216._4_4_ = auVar79._4_4_ * auVar76._4_4_ + fVar182 * auVar83._4_4_;
              auVar216._8_4_ = auVar79._8_4_ * auVar76._8_4_ + fVar182 * auVar83._8_4_;
              auVar216._12_4_ = auVar79._12_4_ * auVar76._12_4_ + fVar182 * auVar83._12_4_;
              auVar76 = vsubps_avx(local_740._0_16_,auVar216);
              auVar230 = ZEXT1664(auVar76);
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar83 = vandps_avx512vl(local_9e0._0_16_,auVar26);
              auVar83 = vucomiss_avx512f(auVar83);
              if (!(bool)uVar69 && !(bool)uVar71) {
                auVar83 = vaddss_avx512f(auVar84,auVar83);
                auVar83 = vfmadd231ss_fma(auVar83,local_960,ZEXT416(0x36000000));
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar79 = vandps_avx512vl(ZEXT416((uint)fVar182),auVar27);
                if (auVar79._0_4_ < auVar83._0_4_) {
                  fVar178 = auVar76._0_4_ + (float)local_970._0_4_;
                  auVar163 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar178 < fVar212) {
LAB_01e40b1e:
                    bVar57 = 0;
                    goto LAB_01e40b43;
                  }
                  fVar180 = *(float *)(ray + k * 4 + 0x200);
                  if (fVar178 <= fVar180) {
                    auVar76 = vmovshdup_avx(auVar76);
                    bVar57 = 0;
                    if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_01e40b43;
                    auVar217._0_12_ = ZEXT812(0);
                    auVar217._12_4_ = 0;
                    auVar193._4_8_ = auVar217._4_8_;
                    auVar193._0_4_ = fVar179;
                    auVar193._12_4_ = 0;
                    auVar76 = vrsqrt14ss_avx512f(auVar217,auVar193);
                    fVar182 = auVar76._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar60].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01e40b1e;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar57 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01e40b43;
                    fVar179 = fVar182 * 1.5 + fVar179 * -0.5 * fVar182 * fVar182 * fVar182;
                    auVar194._0_4_ = auVar77._0_4_ * fVar179;
                    auVar194._4_4_ = auVar77._4_4_ * fVar179;
                    auVar194._8_4_ = auVar77._8_4_ * fVar179;
                    auVar194._12_4_ = auVar77._12_4_ * fVar179;
                    auVar83 = vfmadd213ps_fma(auVar75,auVar194,auVar78);
                    auVar76 = vshufps_avx(auVar194,auVar194,0xc9);
                    auVar77 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar195._0_4_ = auVar194._0_4_ * auVar77._0_4_;
                    auVar195._4_4_ = auVar194._4_4_ * auVar77._4_4_;
                    auVar195._8_4_ = auVar194._8_4_ * auVar77._8_4_;
                    auVar195._12_4_ = auVar194._12_4_ * auVar77._12_4_;
                    auVar78 = vfmsub231ps_fma(auVar195,auVar78,auVar76);
                    auVar76 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar77 = vshufps_avx(auVar83,auVar83,0xc9);
                    auVar78 = vshufps_avx(auVar78,auVar78,0xd2);
                    auVar154._0_4_ = auVar83._0_4_ * auVar78._0_4_;
                    auVar154._4_4_ = auVar83._4_4_ * auVar78._4_4_;
                    auVar154._8_4_ = auVar83._8_4_ * auVar78._8_4_;
                    auVar154._12_4_ = auVar83._12_4_ * auVar78._12_4_;
                    auVar76 = vfmsub231ps_fma(auVar154,auVar76,auVar77);
                    auVar142 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar142,auVar230);
                    auVar230 = vpermps_avx512f(auVar142,ZEXT1664(auVar76));
                    auVar142 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar142,ZEXT1664(auVar76));
                    local_380 = vbroadcastss_avx512f(auVar76);
                    local_400[0] = (RTCHitN)auVar230[0];
                    local_400[1] = (RTCHitN)auVar230[1];
                    local_400[2] = (RTCHitN)auVar230[2];
                    local_400[3] = (RTCHitN)auVar230[3];
                    local_400[4] = (RTCHitN)auVar230[4];
                    local_400[5] = (RTCHitN)auVar230[5];
                    local_400[6] = (RTCHitN)auVar230[6];
                    local_400[7] = (RTCHitN)auVar230[7];
                    local_400[8] = (RTCHitN)auVar230[8];
                    local_400[9] = (RTCHitN)auVar230[9];
                    local_400[10] = (RTCHitN)auVar230[10];
                    local_400[0xb] = (RTCHitN)auVar230[0xb];
                    local_400[0xc] = (RTCHitN)auVar230[0xc];
                    local_400[0xd] = (RTCHitN)auVar230[0xd];
                    local_400[0xe] = (RTCHitN)auVar230[0xe];
                    local_400[0xf] = (RTCHitN)auVar230[0xf];
                    local_400[0x10] = (RTCHitN)auVar230[0x10];
                    local_400[0x11] = (RTCHitN)auVar230[0x11];
                    local_400[0x12] = (RTCHitN)auVar230[0x12];
                    local_400[0x13] = (RTCHitN)auVar230[0x13];
                    local_400[0x14] = (RTCHitN)auVar230[0x14];
                    local_400[0x15] = (RTCHitN)auVar230[0x15];
                    local_400[0x16] = (RTCHitN)auVar230[0x16];
                    local_400[0x17] = (RTCHitN)auVar230[0x17];
                    local_400[0x18] = (RTCHitN)auVar230[0x18];
                    local_400[0x19] = (RTCHitN)auVar230[0x19];
                    local_400[0x1a] = (RTCHitN)auVar230[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar230[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar230[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar230[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar230[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar230[0x1f];
                    local_400[0x20] = (RTCHitN)auVar230[0x20];
                    local_400[0x21] = (RTCHitN)auVar230[0x21];
                    local_400[0x22] = (RTCHitN)auVar230[0x22];
                    local_400[0x23] = (RTCHitN)auVar230[0x23];
                    local_400[0x24] = (RTCHitN)auVar230[0x24];
                    local_400[0x25] = (RTCHitN)auVar230[0x25];
                    local_400[0x26] = (RTCHitN)auVar230[0x26];
                    local_400[0x27] = (RTCHitN)auVar230[0x27];
                    local_400[0x28] = (RTCHitN)auVar230[0x28];
                    local_400[0x29] = (RTCHitN)auVar230[0x29];
                    local_400[0x2a] = (RTCHitN)auVar230[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar230[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar230[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar230[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar230[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar230[0x2f];
                    local_400[0x30] = (RTCHitN)auVar230[0x30];
                    local_400[0x31] = (RTCHitN)auVar230[0x31];
                    local_400[0x32] = (RTCHitN)auVar230[0x32];
                    local_400[0x33] = (RTCHitN)auVar230[0x33];
                    local_400[0x34] = (RTCHitN)auVar230[0x34];
                    local_400[0x35] = (RTCHitN)auVar230[0x35];
                    local_400[0x36] = (RTCHitN)auVar230[0x36];
                    local_400[0x37] = (RTCHitN)auVar230[0x37];
                    local_400[0x38] = (RTCHitN)auVar230[0x38];
                    local_400[0x39] = (RTCHitN)auVar230[0x39];
                    local_400[0x3a] = (RTCHitN)auVar230[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar230[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar230[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar230[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar230[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar230[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar230 = vmovdqa64_avx512f(local_4c0);
                    local_280 = vmovdqa64_avx512f(auVar230);
                    vpcmpeqd_avx2(auVar230._0_32_,auVar230._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar178;
                    auVar230 = vmovdqa64_avx512f(local_500);
                    local_700 = vmovdqa64_avx512f(auVar230);
                    local_a10.valid = (int *)local_700;
                    local_a10.geometryUserPtr = pGVar3->userPtr;
                    local_a10.context = context->user;
                    local_a10.hit = local_400;
                    local_a10.N = 0x10;
                    local_a10.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar256 = ZEXT1664(auVar152);
                      (*pGVar3->occlusionFilterN)(&local_a10);
                      auVar163 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      auVar230 = vmovdqa64_avx512f(local_700);
                    }
                    uVar19 = vptestmd_avx512f(auVar230,auVar230);
                    if ((short)uVar19 != 0) {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar256 = ZEXT1664(auVar256._0_16_);
                        (*p_Var8)(&local_a10);
                        auVar163 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        auVar230 = vmovdqa64_avx512f(local_700);
                      }
                      uVar72 = vptestmd_avx512f(auVar230,auVar230);
                      auVar230 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar15 = (bool)((byte)uVar72 & 1);
                      auVar142._0_4_ =
                           (uint)bVar15 * auVar230._0_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x200);
                      bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
                      auVar142._4_4_ =
                           (uint)bVar15 * auVar230._4_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x204);
                      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
                      auVar142._8_4_ =
                           (uint)bVar15 * auVar230._8_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x208);
                      bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
                      auVar142._12_4_ =
                           (uint)bVar15 * auVar230._12_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x20c);
                      bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
                      auVar142._16_4_ =
                           (uint)bVar15 * auVar230._16_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x210);
                      bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
                      auVar142._20_4_ =
                           (uint)bVar15 * auVar230._20_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x214);
                      bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
                      auVar142._24_4_ =
                           (uint)bVar15 * auVar230._24_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x218);
                      bVar15 = (bool)((byte)(uVar72 >> 7) & 1);
                      auVar142._28_4_ =
                           (uint)bVar15 * auVar230._28_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x21c);
                      bVar15 = (bool)((byte)(uVar72 >> 8) & 1);
                      auVar142._32_4_ =
                           (uint)bVar15 * auVar230._32_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x220);
                      bVar15 = (bool)((byte)(uVar72 >> 9) & 1);
                      auVar142._36_4_ =
                           (uint)bVar15 * auVar230._36_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x224);
                      bVar15 = (bool)((byte)(uVar72 >> 10) & 1);
                      auVar142._40_4_ =
                           (uint)bVar15 * auVar230._40_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x228);
                      bVar15 = (bool)((byte)(uVar72 >> 0xb) & 1);
                      auVar142._44_4_ =
                           (uint)bVar15 * auVar230._44_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x22c);
                      bVar15 = (bool)((byte)(uVar72 >> 0xc) & 1);
                      auVar142._48_4_ =
                           (uint)bVar15 * auVar230._48_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x230);
                      bVar15 = (bool)((byte)(uVar72 >> 0xd) & 1);
                      auVar142._52_4_ =
                           (uint)bVar15 * auVar230._52_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x234);
                      bVar15 = (bool)((byte)(uVar72 >> 0xe) & 1);
                      auVar142._56_4_ =
                           (uint)bVar15 * auVar230._56_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x238);
                      bVar15 = SUB81(uVar72 >> 0xf,0);
                      auVar142._60_4_ =
                           (uint)bVar15 * auVar230._60_4_ |
                           (uint)!bVar15 * *(int *)(local_a10.ray + 0x23c);
                      *(undefined1 (*) [64])(local_a10.ray + 0x200) = auVar142;
                      bVar57 = 1;
                      if ((short)uVar72 != 0) goto LAB_01e40b43;
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar180;
                  }
                  bVar57 = 0;
                  goto LAB_01e40b43;
                }
              }
              bVar70 = uVar72 < 4;
              uVar72 = uVar72 + 1;
            } while (uVar72 != 5);
            bVar70 = false;
            auVar163 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar57 = 5;
LAB_01e40b43:
            bVar67 = (bool)(bVar67 | bVar70 & bVar57);
            uVar166 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar161._4_4_ = uVar166;
            auVar161._0_4_ = uVar166;
            auVar161._8_4_ = uVar166;
            auVar161._12_4_ = uVar166;
            auVar161._16_4_ = uVar166;
            auVar161._20_4_ = uVar166;
            auVar161._24_4_ = uVar166;
            auVar161._28_4_ = uVar166;
            auVar51._4_4_ = fStack_69c;
            auVar51._0_4_ = local_6a0;
            auVar51._8_4_ = fStack_698;
            auVar51._12_4_ = fStack_694;
            auVar51._16_4_ = fStack_690;
            auVar51._20_4_ = fStack_68c;
            auVar51._24_4_ = fStack_688;
            auVar51._28_4_ = fStack_684;
            uVar19 = vcmpps_avx512vl(auVar161,auVar51,0xd);
            bVar66 = ~('\x01' << ((byte)iVar22 & 0x1f)) & bVar66 & (byte)uVar19;
            auVar88 = local_620;
          } while (bVar66 != 0);
        }
        auVar89 = local_660;
        bVar56 = local_6c0[0] | ~bVar56;
        auVar176._0_4_ = fVar150 + auVar88._0_4_;
        auVar176._4_4_ = fVar150 + auVar88._4_4_;
        auVar176._8_4_ = fVar150 + auVar88._8_4_;
        auVar176._12_4_ = fVar150 + auVar88._12_4_;
        auVar176._16_4_ = fVar150 + auVar88._16_4_;
        auVar176._20_4_ = fVar150 + auVar88._20_4_;
        auVar176._24_4_ = fVar150 + auVar88._24_4_;
        auVar176._28_4_ = fVar150 + auVar88._28_4_;
        uVar19 = vcmpps_avx512vl(auVar176,auVar161,2);
        bVar54 = (byte)uVar20 & bVar54 & (byte)uVar19;
        auVar177._8_4_ = 2;
        auVar177._0_8_ = 0x200000002;
        auVar177._12_4_ = 2;
        auVar177._16_4_ = 2;
        auVar177._20_4_ = 2;
        auVar177._24_4_ = 2;
        auVar177._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar88 = vpblendmd_avx512vl(auVar177,auVar36);
        auVar139._0_4_ = (uint)(bVar56 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar56 & 1) * 2;
        bVar70 = (bool)(bVar56 >> 1 & 1);
        auVar139._4_4_ = (uint)bVar70 * auVar88._4_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar56 >> 2 & 1);
        auVar139._8_4_ = (uint)bVar70 * auVar88._8_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar56 >> 3 & 1);
        auVar139._12_4_ = (uint)bVar70 * auVar88._12_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar56 >> 4 & 1);
        auVar139._16_4_ = (uint)bVar70 * auVar88._16_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar56 >> 5 & 1);
        auVar139._20_4_ = (uint)bVar70 * auVar88._20_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar56 >> 6 & 1);
        auVar139._24_4_ = (uint)bVar70 * auVar88._24_4_ | (uint)!bVar70 * 2;
        auVar139._28_4_ = (uint)(bVar56 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar56 >> 7) * 2;
        uVar19 = vpcmpd_avx512vl(local_680,auVar139,5);
        bVar56 = (byte)uVar19 & bVar54;
        if (bVar56 != 0) {
          auVar77 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar76 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar78 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar83 = vminps_avx(auVar77,auVar78);
          auVar77 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar78 = vmaxps_avx(auVar76,auVar77);
          auVar196._8_4_ = 0x7fffffff;
          auVar196._0_8_ = 0x7fffffff7fffffff;
          auVar196._12_4_ = 0x7fffffff;
          auVar76 = vandps_avx(auVar83,auVar196);
          auVar77 = vandps_avx(auVar78,auVar196);
          auVar76 = vmaxps_avx(auVar76,auVar77);
          auVar77 = vmovshdup_avx(auVar76);
          auVar77 = vmaxss_avx(auVar77,auVar76);
          auVar76 = vshufpd_avx(auVar76,auVar76,1);
          auVar76 = vmaxss_avx(auVar76,auVar77);
          fVar165 = auVar76._0_4_ * 1.9073486e-06;
          local_960 = vshufps_avx(auVar78,auVar78,0xff);
          local_6a0 = fVar150 + local_660._0_4_;
          fStack_69c = fVar150 + local_660._4_4_;
          fStack_698 = fVar150 + local_660._8_4_;
          fStack_694 = fVar150 + local_660._12_4_;
          fStack_690 = fVar150 + local_660._16_4_;
          fStack_68c = fVar150 + local_660._20_4_;
          fStack_688 = fVar150 + local_660._24_4_;
          fStack_684 = fVar150 + local_660._28_4_;
          local_6c0 = auVar139;
          do {
            auVar162._8_4_ = 0x7f800000;
            auVar162._0_8_ = 0x7f8000007f800000;
            auVar162._12_4_ = 0x7f800000;
            auVar162._16_4_ = 0x7f800000;
            auVar162._20_4_ = 0x7f800000;
            auVar162._24_4_ = 0x7f800000;
            auVar162._28_4_ = 0x7f800000;
            auVar88 = vblendmps_avx512vl(auVar162,auVar89);
            auVar140._0_4_ =
                 (uint)(bVar56 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar56 & 1) * 0x7f800000;
            bVar70 = (bool)(bVar56 >> 1 & 1);
            auVar140._4_4_ = (uint)bVar70 * auVar88._4_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar56 >> 2 & 1);
            auVar140._8_4_ = (uint)bVar70 * auVar88._8_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar56 >> 3 & 1);
            auVar140._12_4_ = (uint)bVar70 * auVar88._12_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar56 >> 4 & 1);
            auVar140._16_4_ = (uint)bVar70 * auVar88._16_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar56 >> 5 & 1);
            auVar140._20_4_ = (uint)bVar70 * auVar88._20_4_ | (uint)!bVar70 * 0x7f800000;
            auVar140._24_4_ =
                 (uint)(bVar56 >> 6) * auVar88._24_4_ | (uint)!(bool)(bVar56 >> 6) * 0x7f800000;
            auVar140._28_4_ = 0x7f800000;
            auVar88 = vshufps_avx(auVar140,auVar140,0xb1);
            auVar88 = vminps_avx(auVar140,auVar88);
            auVar102 = vshufpd_avx(auVar88,auVar88,5);
            auVar88 = vminps_avx(auVar88,auVar102);
            auVar102 = vpermpd_avx2(auVar88,0x4e);
            auVar88 = vminps_avx(auVar88,auVar102);
            uVar19 = vcmpps_avx512vl(auVar140,auVar88,0);
            bVar57 = (byte)uVar19 & bVar56;
            bVar66 = bVar56;
            if (bVar57 != 0) {
              bVar66 = bVar57;
            }
            iVar22 = 0;
            for (uVar73 = (uint)bVar66; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            uVar73 = *(uint *)(local_540 + (uint)(iVar22 << 2));
            uVar64 = *(uint *)(local_640 + (uint)(iVar22 << 2));
            fVar178 = auVar74._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar178 = sqrtf((float)local_9c0._0_4_);
            }
            auVar76 = vinsertps_avx(ZEXT416(uVar64),ZEXT416(uVar73),0x10);
            auVar230 = ZEXT1664(auVar76);
            bVar70 = true;
            uVar72 = 0;
            do {
              uVar166 = auVar230._0_4_;
              auVar155._4_4_ = uVar166;
              auVar155._0_4_ = uVar166;
              auVar155._8_4_ = uVar166;
              auVar155._12_4_ = uVar166;
              auVar77 = vfmadd132ps_fma(auVar155,ZEXT816(0) << 0x40,local_9b0);
              auVar78 = auVar230._0_16_;
              auVar76 = vmovshdup_avx(auVar78);
              local_7e0._0_16_ = auVar76;
              fVar183 = 1.0 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar78,auVar78,0x55);
              fVar179 = auVar76._0_4_;
              auVar197._0_4_ = local_8c0._0_4_ * fVar179;
              fVar180 = auVar76._4_4_;
              auVar197._4_4_ = local_8c0._4_4_ * fVar180;
              fVar182 = auVar76._8_4_;
              auVar197._8_4_ = local_8c0._8_4_ * fVar182;
              fVar181 = auVar76._12_4_;
              auVar197._12_4_ = local_8c0._12_4_ * fVar181;
              _local_7c0 = ZEXT416((uint)fVar183);
              auVar218._4_4_ = fVar183;
              auVar218._0_4_ = fVar183;
              auVar218._8_4_ = fVar183;
              auVar218._12_4_ = fVar183;
              auVar76 = vfmadd231ps_fma(auVar197,auVar218,local_880._0_16_);
              auVar226._0_4_ = local_8a0._0_4_ * fVar179;
              auVar226._4_4_ = local_8a0._4_4_ * fVar180;
              auVar226._8_4_ = local_8a0._8_4_ * fVar182;
              auVar226._12_4_ = local_8a0._12_4_ * fVar181;
              auVar78 = vfmadd231ps_fma(auVar226,auVar218,local_8c0._0_16_);
              auVar235._0_4_ = fVar179 * (float)local_8e0._0_4_;
              auVar235._4_4_ = fVar180 * (float)local_8e0._4_4_;
              auVar235._8_4_ = fVar182 * fStack_8d8;
              auVar235._12_4_ = fVar181 * fStack_8d4;
              auVar83 = vfmadd231ps_fma(auVar235,auVar218,local_8a0._0_16_);
              auVar243._0_4_ = fVar179 * auVar78._0_4_;
              auVar243._4_4_ = fVar180 * auVar78._4_4_;
              auVar243._8_4_ = fVar182 * auVar78._8_4_;
              auVar243._12_4_ = fVar181 * auVar78._12_4_;
              auVar76 = vfmadd231ps_fma(auVar243,auVar218,auVar76);
              auVar198._0_4_ = fVar179 * auVar83._0_4_;
              auVar198._4_4_ = fVar180 * auVar83._4_4_;
              auVar198._8_4_ = fVar182 * auVar83._8_4_;
              auVar198._12_4_ = fVar181 * auVar83._12_4_;
              auVar78 = vfmadd231ps_fma(auVar198,auVar218,auVar78);
              auVar227._0_4_ = fVar179 * auVar78._0_4_;
              auVar227._4_4_ = fVar180 * auVar78._4_4_;
              auVar227._8_4_ = fVar182 * auVar78._8_4_;
              auVar227._12_4_ = fVar181 * auVar78._12_4_;
              auVar83 = vfmadd231ps_fma(auVar227,auVar76,auVar218);
              auVar76 = vsubps_avx(auVar78,auVar76);
              auVar28._8_4_ = 0x40400000;
              auVar28._0_8_ = 0x4040000040400000;
              auVar28._12_4_ = 0x40400000;
              auVar78 = vmulps_avx512vl(auVar76,auVar28);
              local_7a0._0_16_ = auVar83;
              auVar77 = vsubps_avx(auVar77,auVar83);
              auVar76 = vdpps_avx(auVar77,auVar77,0x7f);
              fVar179 = auVar76._0_4_;
              local_740 = auVar230;
              if (fVar179 < 0.0) {
                auVar164._0_4_ = sqrtf(fVar179);
                auVar164._4_60_ = extraout_var_00;
                auVar83 = auVar164._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx(auVar76,auVar76);
              }
              local_800._0_16_ = vdpps_avx(auVar78,auVar78,0x7f);
              fVar180 = local_800._0_4_;
              auVar199._4_12_ = ZEXT812(0) << 0x20;
              auVar199._0_4_ = fVar180;
              local_9e0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar199);
              fVar182 = local_9e0._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar199);
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar75 = vxorps_avx512vl(local_800._0_16_,auVar29);
              auVar79 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar79._0_4_;
              local_9a0._0_4_ = auVar83._0_4_;
              if (fVar180 < auVar75._0_4_) {
                fVar181 = sqrtf(fVar180);
                auVar83 = ZEXT416((uint)local_9a0._0_4_);
              }
              else {
                auVar79 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar181 = auVar79._0_4_;
              }
              fVar183 = local_9e0._0_4_;
              auVar75 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar182 * 1.5 +
                                                 fVar180 * -0.5 * fVar183 * fVar183 * fVar183)));
              auVar79 = vmulps_avx512vl(auVar78,auVar75);
              local_9e0._0_16_ = vdpps_avx(auVar77,auVar79,0x7f);
              auVar81 = vaddss_avx512f(auVar83,ZEXT416(0x3f800000));
              auVar156._0_4_ = local_9e0._0_4_ * local_9e0._0_4_;
              auVar156._4_4_ = local_9e0._4_4_ * local_9e0._4_4_;
              auVar156._8_4_ = local_9e0._8_4_ * local_9e0._8_4_;
              auVar156._12_4_ = local_9e0._12_4_ * local_9e0._12_4_;
              auVar76 = vsubps_avx(auVar76,auVar156);
              fVar180 = auVar76._0_4_;
              auVar171._4_12_ = ZEXT812(0) << 0x20;
              auVar171._0_4_ = fVar180;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
              auVar84 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
              auVar85 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
              uVar71 = fVar180 == 0.0;
              uVar69 = fVar180 < 0.0;
              if ((bool)uVar69) {
                local_930._0_4_ = auVar84._0_4_;
                _local_950 = auVar75;
                local_940 = auVar79;
                local_920 = auVar80;
                fVar180 = sqrtf(fVar180);
                auVar85 = ZEXT416(auVar85._0_4_);
                auVar84 = ZEXT416((uint)local_930._0_4_);
                auVar83 = ZEXT416((uint)local_9a0._0_4_);
                auVar81 = ZEXT416(auVar81._0_4_);
                auVar79 = local_940;
                auVar80 = local_920;
                auVar75 = _local_950;
              }
              else {
                auVar76 = vsqrtss_avx(auVar76,auVar76);
                fVar180 = auVar76._0_4_;
              }
              in_ZMM31 = ZEXT1664(auVar75);
              auVar256 = ZEXT1664(auVar79);
              auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_);
              auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar182 = auVar76._0_4_ * 6.0;
              fVar183 = local_7e0._0_4_ * 6.0;
              auVar219._0_4_ = fVar183 * (float)local_8e0._0_4_;
              auVar219._4_4_ = fVar183 * (float)local_8e0._4_4_;
              auVar219._8_4_ = fVar183 * fStack_8d8;
              auVar219._12_4_ = fVar183 * fStack_8d4;
              auVar200._4_4_ = fVar182;
              auVar200._0_4_ = fVar182;
              auVar200._8_4_ = fVar182;
              auVar200._12_4_ = fVar182;
              auVar76 = vfmadd132ps_fma(auVar200,auVar219,local_8a0._0_16_);
              fVar182 = auVar82._0_4_ * 6.0;
              auVar172._4_4_ = fVar182;
              auVar172._0_4_ = fVar182;
              auVar172._8_4_ = fVar182;
              auVar172._12_4_ = fVar182;
              auVar76 = vfmadd132ps_fma(auVar172,auVar76,local_8c0._0_16_);
              fVar182 = local_7c0._0_4_ * 6.0;
              auVar201._4_4_ = fVar182;
              auVar201._0_4_ = fVar182;
              auVar201._8_4_ = fVar182;
              auVar201._12_4_ = fVar182;
              auVar76 = vfmadd132ps_fma(auVar201,auVar76,local_880._0_16_);
              auVar173._0_4_ = auVar76._0_4_ * (float)local_800._0_4_;
              auVar173._4_4_ = auVar76._4_4_ * (float)local_800._0_4_;
              auVar173._8_4_ = auVar76._8_4_ * (float)local_800._0_4_;
              auVar173._12_4_ = auVar76._12_4_ * (float)local_800._0_4_;
              auVar76 = vdpps_avx(auVar78,auVar76,0x7f);
              fVar182 = auVar76._0_4_;
              auVar202._0_4_ = auVar78._0_4_ * fVar182;
              auVar202._4_4_ = auVar78._4_4_ * fVar182;
              auVar202._8_4_ = auVar78._8_4_ * fVar182;
              auVar202._12_4_ = auVar78._12_4_ * fVar182;
              auVar76 = vsubps_avx(auVar173,auVar202);
              fVar182 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar82 = vmaxss_avx(ZEXT416((uint)fVar165),
                                   ZEXT416((uint)(local_740._0_4_ * fVar178 * 1.9073486e-06)));
              auVar203._0_4_ = auVar76._0_4_ * fVar182;
              auVar203._4_4_ = auVar76._4_4_ * fVar182;
              auVar203._8_4_ = auVar76._8_4_ * fVar182;
              auVar203._12_4_ = auVar76._12_4_ * fVar182;
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar86 = vxorps_avx512vl(auVar78,auVar30);
              auVar87 = vmulps_avx512vl(auVar75,auVar203);
              auVar76 = vdpps_avx(auVar86,auVar79,0x7f);
              auVar75 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar165),auVar82);
              auVar83 = vdpps_avx(auVar77,auVar87,0x7f);
              vfmadd213ss_avx512f(auVar81,ZEXT416((uint)(fVar165 / fVar181)),auVar75);
              fVar182 = auVar76._0_4_ + auVar83._0_4_;
              auVar76 = vdpps_avx(local_9b0,auVar79,0x7f);
              auVar83 = vdpps_avx(auVar77,auVar86,0x7f);
              auVar75 = vmulss_avx512f(auVar85,auVar80);
              auVar80 = vmulss_avx512f(auVar80,auVar80);
              auVar81 = vaddss_avx512f(auVar84,ZEXT416((uint)(auVar75._0_4_ * auVar80._0_4_)));
              auVar75 = vdpps_avx(auVar77,local_9b0,0x7f);
              auVar84 = vfnmadd231ss_avx512f(auVar83,local_9e0._0_16_,ZEXT416((uint)fVar182));
              auVar75 = vfnmadd231ss_avx512f(auVar75,local_9e0._0_16_,auVar76);
              auVar83 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar180 = fVar180 - auVar83._0_4_;
              auVar80 = vshufps_avx(auVar78,auVar78,0xff);
              auVar83 = vfmsub213ss_fma(auVar84,auVar81,auVar80);
              auVar247._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
              auVar247._8_4_ = auVar83._8_4_ ^ 0x80000000;
              auVar247._12_4_ = auVar83._12_4_ ^ 0x80000000;
              auVar75 = ZEXT416((uint)(auVar75._0_4_ * auVar81._0_4_));
              auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar83._0_4_)),
                                        ZEXT416((uint)fVar182),auVar75);
              auVar83 = vinsertps_avx(auVar247,auVar75,0x1c);
              auVar236._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
              auVar236._8_4_ = auVar76._8_4_ ^ 0x80000000;
              auVar236._12_4_ = auVar76._12_4_ ^ 0x80000000;
              auVar75 = vinsertps_avx(ZEXT416((uint)fVar182),auVar236,0x10);
              auVar220._0_4_ = auVar81._0_4_;
              auVar220._4_4_ = auVar220._0_4_;
              auVar220._8_4_ = auVar220._0_4_;
              auVar220._12_4_ = auVar220._0_4_;
              auVar76 = vdivps_avx(auVar83,auVar220);
              auVar83 = vdivps_avx(auVar75,auVar220);
              auVar75 = vbroadcastss_avx512vl(local_9e0._0_16_);
              auVar221._0_4_ = auVar75._0_4_ * auVar76._0_4_ + fVar180 * auVar83._0_4_;
              auVar221._4_4_ = auVar75._4_4_ * auVar76._4_4_ + fVar180 * auVar83._4_4_;
              auVar221._8_4_ = auVar75._8_4_ * auVar76._8_4_ + fVar180 * auVar83._8_4_;
              auVar221._12_4_ = auVar75._12_4_ * auVar76._12_4_ + fVar180 * auVar83._12_4_;
              auVar76 = vsubps_avx(local_740._0_16_,auVar221);
              auVar230 = ZEXT1664(auVar76);
              auVar31._8_4_ = 0x7fffffff;
              auVar31._0_8_ = 0x7fffffff7fffffff;
              auVar31._12_4_ = 0x7fffffff;
              auVar83 = vandps_avx512vl(local_9e0._0_16_,auVar31);
              auVar83 = vucomiss_avx512f(auVar83);
              if (!(bool)uVar69 && !(bool)uVar71) {
                auVar83 = vaddss_avx512f(auVar82,auVar83);
                auVar83 = vfmadd231ss_fma(auVar83,local_960,ZEXT416(0x36000000));
                auVar32._8_4_ = 0x7fffffff;
                auVar32._0_8_ = 0x7fffffff7fffffff;
                auVar32._12_4_ = 0x7fffffff;
                auVar75 = vandps_avx512vl(ZEXT416((uint)fVar180),auVar32);
                if (auVar75._0_4_ < auVar83._0_4_) {
                  fVar178 = auVar76._0_4_ + (float)local_970._0_4_;
                  auVar163 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar212 <= fVar178) {
                    fVar180 = *(float *)(ray + k * 4 + 0x200);
                    if (fVar180 < fVar178) {
                      bVar66 = 0;
                      goto LAB_01e4179c;
                    }
                    auVar76 = vmovshdup_avx(auVar76);
                    bVar66 = 0;
                    if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_01e4179c;
                    auVar222._0_12_ = ZEXT812(0);
                    auVar222._12_4_ = 0;
                    auVar204._4_8_ = auVar222._4_8_;
                    auVar204._0_4_ = fVar179;
                    auVar204._12_4_ = 0;
                    auVar76 = vrsqrt14ss_avx512f(auVar222,auVar204);
                    fVar182 = auVar76._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar60].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar66 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01e4179c;
                      fVar179 = fVar182 * 1.5 + fVar179 * -0.5 * fVar182 * fVar182 * fVar182;
                      auVar205._0_4_ = auVar77._0_4_ * fVar179;
                      auVar205._4_4_ = auVar77._4_4_ * fVar179;
                      auVar205._8_4_ = auVar77._8_4_ * fVar179;
                      auVar205._12_4_ = auVar77._12_4_ * fVar179;
                      auVar83 = vfmadd213ps_fma(auVar80,auVar205,auVar78);
                      auVar76 = vshufps_avx(auVar205,auVar205,0xc9);
                      auVar77 = vshufps_avx(auVar78,auVar78,0xc9);
                      auVar206._0_4_ = auVar205._0_4_ * auVar77._0_4_;
                      auVar206._4_4_ = auVar205._4_4_ * auVar77._4_4_;
                      auVar206._8_4_ = auVar205._8_4_ * auVar77._8_4_;
                      auVar206._12_4_ = auVar205._12_4_ * auVar77._12_4_;
                      auVar78 = vfmsub231ps_fma(auVar206,auVar78,auVar76);
                      auVar76 = vshufps_avx(auVar78,auVar78,0xc9);
                      auVar77 = vshufps_avx(auVar83,auVar83,0xc9);
                      auVar78 = vshufps_avx(auVar78,auVar78,0xd2);
                      auVar157._0_4_ = auVar83._0_4_ * auVar78._0_4_;
                      auVar157._4_4_ = auVar83._4_4_ * auVar78._4_4_;
                      auVar157._8_4_ = auVar83._8_4_ * auVar78._8_4_;
                      auVar157._12_4_ = auVar83._12_4_ * auVar78._12_4_;
                      auVar76 = vfmsub231ps_fma(auVar157,auVar76,auVar77);
                      auVar142 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar142,auVar230);
                      auVar230 = vpermps_avx512f(auVar142,ZEXT1664(auVar76));
                      auVar142 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar142,ZEXT1664(auVar76));
                      local_380 = vbroadcastss_avx512f(auVar76);
                      local_400[0] = (RTCHitN)auVar230[0];
                      local_400[1] = (RTCHitN)auVar230[1];
                      local_400[2] = (RTCHitN)auVar230[2];
                      local_400[3] = (RTCHitN)auVar230[3];
                      local_400[4] = (RTCHitN)auVar230[4];
                      local_400[5] = (RTCHitN)auVar230[5];
                      local_400[6] = (RTCHitN)auVar230[6];
                      local_400[7] = (RTCHitN)auVar230[7];
                      local_400[8] = (RTCHitN)auVar230[8];
                      local_400[9] = (RTCHitN)auVar230[9];
                      local_400[10] = (RTCHitN)auVar230[10];
                      local_400[0xb] = (RTCHitN)auVar230[0xb];
                      local_400[0xc] = (RTCHitN)auVar230[0xc];
                      local_400[0xd] = (RTCHitN)auVar230[0xd];
                      local_400[0xe] = (RTCHitN)auVar230[0xe];
                      local_400[0xf] = (RTCHitN)auVar230[0xf];
                      local_400[0x10] = (RTCHitN)auVar230[0x10];
                      local_400[0x11] = (RTCHitN)auVar230[0x11];
                      local_400[0x12] = (RTCHitN)auVar230[0x12];
                      local_400[0x13] = (RTCHitN)auVar230[0x13];
                      local_400[0x14] = (RTCHitN)auVar230[0x14];
                      local_400[0x15] = (RTCHitN)auVar230[0x15];
                      local_400[0x16] = (RTCHitN)auVar230[0x16];
                      local_400[0x17] = (RTCHitN)auVar230[0x17];
                      local_400[0x18] = (RTCHitN)auVar230[0x18];
                      local_400[0x19] = (RTCHitN)auVar230[0x19];
                      local_400[0x1a] = (RTCHitN)auVar230[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar230[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar230[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar230[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar230[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar230[0x1f];
                      local_400[0x20] = (RTCHitN)auVar230[0x20];
                      local_400[0x21] = (RTCHitN)auVar230[0x21];
                      local_400[0x22] = (RTCHitN)auVar230[0x22];
                      local_400[0x23] = (RTCHitN)auVar230[0x23];
                      local_400[0x24] = (RTCHitN)auVar230[0x24];
                      local_400[0x25] = (RTCHitN)auVar230[0x25];
                      local_400[0x26] = (RTCHitN)auVar230[0x26];
                      local_400[0x27] = (RTCHitN)auVar230[0x27];
                      local_400[0x28] = (RTCHitN)auVar230[0x28];
                      local_400[0x29] = (RTCHitN)auVar230[0x29];
                      local_400[0x2a] = (RTCHitN)auVar230[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar230[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar230[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar230[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar230[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar230[0x2f];
                      local_400[0x30] = (RTCHitN)auVar230[0x30];
                      local_400[0x31] = (RTCHitN)auVar230[0x31];
                      local_400[0x32] = (RTCHitN)auVar230[0x32];
                      local_400[0x33] = (RTCHitN)auVar230[0x33];
                      local_400[0x34] = (RTCHitN)auVar230[0x34];
                      local_400[0x35] = (RTCHitN)auVar230[0x35];
                      local_400[0x36] = (RTCHitN)auVar230[0x36];
                      local_400[0x37] = (RTCHitN)auVar230[0x37];
                      local_400[0x38] = (RTCHitN)auVar230[0x38];
                      local_400[0x39] = (RTCHitN)auVar230[0x39];
                      local_400[0x3a] = (RTCHitN)auVar230[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar230[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar230[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar230[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar230[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar230[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar230 = vmovdqa64_avx512f(local_4c0);
                      local_280 = vmovdqa64_avx512f(auVar230);
                      vpcmpeqd_avx2(auVar230._0_32_,auVar230._0_32_);
                      local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar178;
                      auVar230 = vmovdqa64_avx512f(local_500);
                      local_700 = vmovdqa64_avx512f(auVar230);
                      local_a10.valid = (int *)local_700;
                      local_a10.geometryUserPtr = pGVar3->userPtr;
                      local_a10.context = context->user;
                      local_a10.hit = local_400;
                      local_a10.N = 0x10;
                      local_a10.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar256 = ZEXT1664(auVar79);
                        (*pGVar3->occlusionFilterN)(&local_a10);
                        auVar163 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        auVar230 = vmovdqa64_avx512f(local_700);
                      }
                      uVar19 = vptestmd_avx512f(auVar230,auVar230);
                      if ((short)uVar19 != 0) {
                        p_Var8 = context->args->filter;
                        if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar256 = ZEXT1664(auVar256._0_16_);
                          (*p_Var8)(&local_a10);
                          auVar163 = ZEXT3264(CONCAT428(0x3f800000,
                                                        CONCAT424(0x3f800000,
                                                                  CONCAT420(0x3f800000,
                                                                            CONCAT416(0x3f800000,
                                                                                      CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                          auVar230 = vmovdqa64_avx512f(local_700);
                        }
                        uVar72 = vptestmd_avx512f(auVar230,auVar230);
                        auVar230 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar15 = (bool)((byte)uVar72 & 1);
                        auVar143._0_4_ =
                             (uint)bVar15 * auVar230._0_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x200);
                        bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
                        auVar143._4_4_ =
                             (uint)bVar15 * auVar230._4_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x204);
                        bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
                        auVar143._8_4_ =
                             (uint)bVar15 * auVar230._8_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x208);
                        bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
                        auVar143._12_4_ =
                             (uint)bVar15 * auVar230._12_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x20c);
                        bVar15 = (bool)((byte)(uVar72 >> 4) & 1);
                        auVar143._16_4_ =
                             (uint)bVar15 * auVar230._16_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x210);
                        bVar15 = (bool)((byte)(uVar72 >> 5) & 1);
                        auVar143._20_4_ =
                             (uint)bVar15 * auVar230._20_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x214);
                        bVar15 = (bool)((byte)(uVar72 >> 6) & 1);
                        auVar143._24_4_ =
                             (uint)bVar15 * auVar230._24_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x218);
                        bVar15 = (bool)((byte)(uVar72 >> 7) & 1);
                        auVar143._28_4_ =
                             (uint)bVar15 * auVar230._28_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x21c);
                        bVar15 = (bool)((byte)(uVar72 >> 8) & 1);
                        auVar143._32_4_ =
                             (uint)bVar15 * auVar230._32_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x220);
                        bVar15 = (bool)((byte)(uVar72 >> 9) & 1);
                        auVar143._36_4_ =
                             (uint)bVar15 * auVar230._36_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x224);
                        bVar15 = (bool)((byte)(uVar72 >> 10) & 1);
                        auVar143._40_4_ =
                             (uint)bVar15 * auVar230._40_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x228);
                        bVar15 = (bool)((byte)(uVar72 >> 0xb) & 1);
                        auVar143._44_4_ =
                             (uint)bVar15 * auVar230._44_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x22c);
                        bVar15 = (bool)((byte)(uVar72 >> 0xc) & 1);
                        auVar143._48_4_ =
                             (uint)bVar15 * auVar230._48_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x230);
                        bVar15 = (bool)((byte)(uVar72 >> 0xd) & 1);
                        auVar143._52_4_ =
                             (uint)bVar15 * auVar230._52_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x234);
                        bVar15 = (bool)((byte)(uVar72 >> 0xe) & 1);
                        auVar143._56_4_ =
                             (uint)bVar15 * auVar230._56_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x238);
                        bVar15 = SUB81(uVar72 >> 0xf,0);
                        auVar143._60_4_ =
                             (uint)bVar15 * auVar230._60_4_ |
                             (uint)!bVar15 * *(int *)(local_a10.ray + 0x23c);
                        *(undefined1 (*) [64])(local_a10.ray + 0x200) = auVar143;
                        bVar66 = 1;
                        if ((short)uVar72 != 0) goto LAB_01e4179c;
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar180;
                      bVar66 = 0;
                      goto LAB_01e4179c;
                    }
                  }
                  bVar66 = 0;
                  goto LAB_01e4179c;
                }
              }
              bVar70 = uVar72 < 4;
              uVar72 = uVar72 + 1;
            } while (uVar72 != 5);
            bVar70 = false;
            auVar163 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            bVar66 = 5;
LAB_01e4179c:
            bVar67 = (bool)(bVar67 | bVar70 & bVar66);
            uVar166 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar161._4_4_ = uVar166;
            auVar161._0_4_ = uVar166;
            auVar161._8_4_ = uVar166;
            auVar161._12_4_ = uVar166;
            auVar161._16_4_ = uVar166;
            auVar161._20_4_ = uVar166;
            auVar161._24_4_ = uVar166;
            auVar161._28_4_ = uVar166;
            auVar52._4_4_ = fStack_69c;
            auVar52._0_4_ = local_6a0;
            auVar52._8_4_ = fStack_698;
            auVar52._12_4_ = fStack_694;
            auVar52._16_4_ = fStack_690;
            auVar52._20_4_ = fStack_68c;
            auVar52._24_4_ = fStack_688;
            auVar52._28_4_ = fStack_684;
            uVar19 = vcmpps_avx512vl(auVar161,auVar52,0xd);
            bVar56 = ~('\x01' << ((byte)iVar22 & 0x1f)) & bVar56 & (byte)uVar19;
            auVar139 = local_6c0;
          } while (bVar56 != 0);
        }
        auVar230 = ZEXT3264(local_900);
        uVar20 = vpcmpgtd_avx512vl(auVar139,local_680);
        uVar21 = vpcmpd_avx512vl(local_680,local_600,1);
        auVar209._0_4_ = fVar150 + (float)local_440._0_4_;
        auVar209._4_4_ = fVar150 + (float)local_440._4_4_;
        auVar209._8_4_ = fVar150 + fStack_438;
        auVar209._12_4_ = fVar150 + fStack_434;
        auVar209._16_4_ = fVar150 + fStack_430;
        auVar209._20_4_ = fVar150 + fStack_42c;
        auVar209._24_4_ = fVar150 + fStack_428;
        auVar209._28_4_ = fVar150 + fStack_424;
        uVar19 = vcmpps_avx512vl(auVar209,auVar161,2);
        bVar62 = bVar62 & (byte)uVar21 & (byte)uVar19;
        auVar210._0_4_ = fVar150 + local_660._0_4_;
        auVar210._4_4_ = fVar150 + local_660._4_4_;
        auVar210._8_4_ = fVar150 + local_660._8_4_;
        auVar210._12_4_ = fVar150 + local_660._12_4_;
        auVar210._16_4_ = fVar150 + local_660._16_4_;
        auVar210._20_4_ = fVar150 + local_660._20_4_;
        auVar210._24_4_ = fVar150 + local_660._24_4_;
        auVar210._28_4_ = fVar150 + local_660._28_4_;
        uVar19 = vcmpps_avx512vl(auVar210,auVar161,2);
        bVar54 = bVar54 & (byte)uVar20 & (byte)uVar19 | bVar62;
        prim = local_910;
        if (bVar54 != 0) {
          uVar59 = (ulong)uVar63;
          abStack_1a0[uVar59 * 0x60] = bVar54;
          auVar141._0_4_ =
               (uint)(bVar62 & 1) * local_440._0_4_ |
               (uint)!(bool)(bVar62 & 1) * (int)local_660._0_4_;
          bVar70 = (bool)(bVar62 >> 1 & 1);
          auVar141._4_4_ = (uint)bVar70 * local_440._4_4_ | (uint)!bVar70 * (int)local_660._4_4_;
          bVar70 = (bool)(bVar62 >> 2 & 1);
          auVar141._8_4_ = (uint)bVar70 * (int)fStack_438 | (uint)!bVar70 * (int)local_660._8_4_;
          bVar70 = (bool)(bVar62 >> 3 & 1);
          auVar141._12_4_ = (uint)bVar70 * (int)fStack_434 | (uint)!bVar70 * (int)local_660._12_4_;
          bVar70 = (bool)(bVar62 >> 4 & 1);
          auVar141._16_4_ = (uint)bVar70 * (int)fStack_430 | (uint)!bVar70 * (int)local_660._16_4_;
          bVar70 = (bool)(bVar62 >> 5 & 1);
          auVar141._20_4_ = (uint)bVar70 * (int)fStack_42c | (uint)!bVar70 * (int)local_660._20_4_;
          auVar141._24_4_ =
               (uint)(bVar62 >> 6) * (int)fStack_428 |
               (uint)!(bool)(bVar62 >> 6) * (int)local_660._24_4_;
          auVar141._28_4_ = local_660._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar59 * 0x60) = auVar141;
          uVar72 = vmovlps_avx(local_980);
          (&uStack_160)[uVar59 * 0xc] = uVar72;
          aiStack_158[uVar59 * 0x18] = iVar65 + 1;
          uVar63 = uVar63 + 1;
        }
      }
    }
    do {
      uVar73 = uVar63;
      uVar64 = uVar73 - 1;
      if (uVar73 == 0) {
        if (bVar67 != false) {
          return bVar67;
        }
        uVar166 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar38._4_4_ = uVar166;
        auVar38._0_4_ = uVar166;
        auVar38._8_4_ = uVar166;
        auVar38._12_4_ = uVar166;
        auVar38._16_4_ = uVar166;
        auVar38._20_4_ = uVar166;
        auVar38._24_4_ = uVar166;
        auVar38._28_4_ = uVar166;
        uVar19 = vcmpps_avx512vl(local_5e0,auVar38,2);
        uVar60 = (uint)uVar19 & (uint)local_908 - 1 & (uint)local_908;
        local_908 = (ulong)uVar60;
        if (uVar60 == 0) {
          return false;
        }
        goto LAB_01e3f3cd;
      }
      uVar72 = (ulong)uVar64;
      lVar61 = uVar72 * 0x60;
      auVar88 = *(undefined1 (*) [32])(auStack_180 + lVar61);
      auVar174._0_4_ = fVar150 + auVar88._0_4_;
      auVar174._4_4_ = fVar150 + auVar88._4_4_;
      auVar174._8_4_ = fVar150 + auVar88._8_4_;
      auVar174._12_4_ = fVar150 + auVar88._12_4_;
      auVar174._16_4_ = fVar150 + auVar88._16_4_;
      auVar174._20_4_ = fVar150 + auVar88._20_4_;
      auVar174._24_4_ = fVar150 + auVar88._24_4_;
      auVar174._28_4_ = fVar150 + auVar88._28_4_;
      uVar166 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar37._4_4_ = uVar166;
      auVar37._0_4_ = uVar166;
      auVar37._8_4_ = uVar166;
      auVar37._12_4_ = uVar166;
      auVar37._16_4_ = uVar166;
      auVar37._20_4_ = uVar166;
      auVar37._24_4_ = uVar166;
      auVar37._28_4_ = uVar166;
      uVar19 = vcmpps_avx512vl(auVar174,auVar37,2);
      uVar58 = (uint)uVar19 & (uint)abStack_1a0[lVar61];
      uVar63 = uVar64;
    } while (uVar58 == 0);
    uVar59 = (&uStack_160)[uVar72 * 0xc];
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar59;
    auVar208._8_4_ = 0x7f800000;
    auVar208._0_8_ = 0x7f8000007f800000;
    auVar208._12_4_ = 0x7f800000;
    auVar208._16_4_ = 0x7f800000;
    auVar208._20_4_ = 0x7f800000;
    auVar208._24_4_ = 0x7f800000;
    auVar208._28_4_ = 0x7f800000;
    auVar89 = vblendmps_avx512vl(auVar208,auVar88);
    bVar54 = (byte)uVar58;
    auVar137._0_4_ =
         (uint)(bVar54 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar54 & 1) * (int)auVar88._0_4_;
    bVar70 = (bool)((byte)(uVar58 >> 1) & 1);
    auVar137._4_4_ = (uint)bVar70 * auVar89._4_4_ | (uint)!bVar70 * (int)auVar88._4_4_;
    bVar70 = (bool)((byte)(uVar58 >> 2) & 1);
    auVar137._8_4_ = (uint)bVar70 * auVar89._8_4_ | (uint)!bVar70 * (int)auVar88._8_4_;
    bVar70 = (bool)((byte)(uVar58 >> 3) & 1);
    auVar137._12_4_ = (uint)bVar70 * auVar89._12_4_ | (uint)!bVar70 * (int)auVar88._12_4_;
    bVar70 = (bool)((byte)(uVar58 >> 4) & 1);
    auVar137._16_4_ = (uint)bVar70 * auVar89._16_4_ | (uint)!bVar70 * (int)auVar88._16_4_;
    bVar70 = (bool)((byte)(uVar58 >> 5) & 1);
    auVar137._20_4_ = (uint)bVar70 * auVar89._20_4_ | (uint)!bVar70 * (int)auVar88._20_4_;
    bVar70 = (bool)((byte)(uVar58 >> 6) & 1);
    auVar137._24_4_ = (uint)bVar70 * auVar89._24_4_ | (uint)!bVar70 * (int)auVar88._24_4_;
    auVar137._28_4_ =
         (uVar58 >> 7) * auVar89._28_4_ | (uint)!SUB41(uVar58 >> 7,0) * (int)auVar88._28_4_;
    auVar88 = vshufps_avx(auVar137,auVar137,0xb1);
    auVar88 = vminps_avx(auVar137,auVar88);
    auVar89 = vshufpd_avx(auVar88,auVar88,5);
    auVar88 = vminps_avx(auVar88,auVar89);
    auVar89 = vpermpd_avx2(auVar88,0x4e);
    auVar88 = vminps_avx(auVar88,auVar89);
    uVar19 = vcmpps_avx512vl(auVar137,auVar88,0);
    bVar56 = (byte)uVar19 & bVar54;
    if (bVar56 != 0) {
      uVar58 = (uint)bVar56;
    }
    uVar144 = 0;
    for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x80000000) {
      uVar144 = uVar144 + 1;
    }
    iVar65 = aiStack_158[uVar72 * 0x18];
    bVar54 = ~('\x01' << ((byte)uVar144 & 0x1f)) & bVar54;
    abStack_1a0[lVar61] = bVar54;
    uVar63 = uVar73;
    if (bVar54 == 0) {
      uVar63 = uVar64;
    }
    uVar166 = (undefined4)uVar59;
    auVar158._4_4_ = uVar166;
    auVar158._0_4_ = uVar166;
    auVar158._8_4_ = uVar166;
    auVar158._12_4_ = uVar166;
    auVar158._16_4_ = uVar166;
    auVar158._20_4_ = uVar166;
    auVar158._24_4_ = uVar166;
    auVar158._28_4_ = uVar166;
    auVar76 = vmovshdup_avx(auVar167);
    auVar76 = vsubps_avx(auVar76,auVar167);
    auVar175._0_4_ = auVar76._0_4_;
    auVar175._4_4_ = auVar175._0_4_;
    auVar175._8_4_ = auVar175._0_4_;
    auVar175._12_4_ = auVar175._0_4_;
    auVar175._16_4_ = auVar175._0_4_;
    auVar175._20_4_ = auVar175._0_4_;
    auVar175._24_4_ = auVar175._0_4_;
    auVar175._28_4_ = auVar175._0_4_;
    auVar76 = vfmadd132ps_fma(auVar175,auVar158,_DAT_01faff20);
    auVar88 = ZEXT1632(auVar76);
    local_400[0] = (RTCHitN)auVar88[0];
    local_400[1] = (RTCHitN)auVar88[1];
    local_400[2] = (RTCHitN)auVar88[2];
    local_400[3] = (RTCHitN)auVar88[3];
    local_400[4] = (RTCHitN)auVar88[4];
    local_400[5] = (RTCHitN)auVar88[5];
    local_400[6] = (RTCHitN)auVar88[6];
    local_400[7] = (RTCHitN)auVar88[7];
    local_400[8] = (RTCHitN)auVar88[8];
    local_400[9] = (RTCHitN)auVar88[9];
    local_400[10] = (RTCHitN)auVar88[10];
    local_400[0xb] = (RTCHitN)auVar88[0xb];
    local_400[0xc] = (RTCHitN)auVar88[0xc];
    local_400[0xd] = (RTCHitN)auVar88[0xd];
    local_400[0xe] = (RTCHitN)auVar88[0xe];
    local_400[0xf] = (RTCHitN)auVar88[0xf];
    local_400[0x10] = (RTCHitN)auVar88[0x10];
    local_400[0x11] = (RTCHitN)auVar88[0x11];
    local_400[0x12] = (RTCHitN)auVar88[0x12];
    local_400[0x13] = (RTCHitN)auVar88[0x13];
    local_400[0x14] = (RTCHitN)auVar88[0x14];
    local_400[0x15] = (RTCHitN)auVar88[0x15];
    local_400[0x16] = (RTCHitN)auVar88[0x16];
    local_400[0x17] = (RTCHitN)auVar88[0x17];
    local_400[0x18] = (RTCHitN)auVar88[0x18];
    local_400[0x19] = (RTCHitN)auVar88[0x19];
    local_400[0x1a] = (RTCHitN)auVar88[0x1a];
    local_400[0x1b] = (RTCHitN)auVar88[0x1b];
    local_400[0x1c] = (RTCHitN)auVar88[0x1c];
    local_400[0x1d] = (RTCHitN)auVar88[0x1d];
    local_400[0x1e] = (RTCHitN)auVar88[0x1e];
    local_400[0x1f] = (RTCHitN)auVar88[0x1f];
    local_980._8_8_ = 0;
    local_980._0_8_ = *(ulong *)(local_400 + (ulong)uVar144 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }